

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  Allocator *pAVar6;
  ushort uVar7;
  byte bVar8;
  int i_12;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Mat *pMVar14;
  Mat *pMVar15;
  byte bVar16;
  undefined4 uVar17;
  bool *pbVar18;
  Mat *pMVar19;
  byte bVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  byte bVar24;
  uint uVar25;
  Mat *pMVar26;
  Mat *pMVar27;
  Mat *pMVar28;
  undefined1 post_process;
  bool bVar29;
  uint in_R9D;
  void *pvVar30;
  void *pvVar31;
  ulong uVar32;
  long lVar33;
  void *pvVar34;
  bool reduce_c;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float fVar35;
  float extraout_XMM0_Da_00;
  float fVar36;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined8 extraout_XMM0_Qa_00;
  undefined1 extraout_XMM0 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0_00 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_var [12];
  undefined1 auVar56 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar60 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 auVar70 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_XMM0_12 [16];
  undefined8 extraout_XMM0_Qb_02;
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_19 [16];
  undefined8 extraout_XMM0_Qb_05;
  undefined1 extraout_XMM0_20 [16];
  undefined1 extraout_XMM0_21 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined8 extraout_XMM0_Qb_06;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 extraout_XMM0_23 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 extraout_XMM0_24 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_XMM0_27 [16];
  undefined1 extraout_var_03 [12];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 extraout_XMM0_28 [16];
  undefined1 extraout_XMM0_29 [16];
  undefined1 extraout_var_04 [12];
  undefined1 in_XMM1 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  int iVar217;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  Option *in_stack_ffffffffffffff10;
  Mat *local_e0;
  Mat *local_c0;
  void *local_b8;
  void *local_a8;
  void *ptr;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  int iStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  Mat *local_50;
  Mat *local_48;
  int axes_flag [3];
  
  iVar11 = bottom_blob->dims;
  axes_flag[2] = 0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  pMVar19 = top_blob;
  pMVar26 = bottom_blob;
  if (this->reduce_all == 0) {
    pMVar14 = (Mat *)(long)(this->axes).w;
    if (0 < (long)pMVar14) {
      pvVar34 = (this->axes).data;
      pMVar19 = (Mat *)(ulong)(iVar11 + 1U);
      pMVar26 = (Mat *)0x0;
      do {
        iVar9 = *(int *)((long)pvVar34 + (long)pMVar26 * 4);
        in_R9D = iVar9 >> 0x1f & iVar11 + 1U;
        axes_flag[(int)(iVar9 + in_R9D + -1)] = 1;
        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
      } while (pMVar14 != pMVar26);
    }
    auVar134 = _DAT_0016ed80;
    if (iVar11 != 1) {
      if (iVar11 == 2) {
        auVar134._0_4_ = -(uint)(axes_flag[0] == 1);
        auVar134._4_4_ = -(uint)(axes_flag[1] == 1);
        auVar134._8_4_ = -(uint)(axes_flag[1] == 1);
        auVar134._12_4_ = 0xffffffff;
        in_XMM0_Da = (float)axes_flag[0];
      }
      else {
        if (iVar11 == 3) {
          reduce_c = axes_flag[0] == 1;
          auVar134._0_4_ = -(uint)(axes_flag[1] == 1);
          auVar134._4_4_ = -(uint)(axes_flag[2] == 1);
          auVar134._8_4_ = -(uint)(axes_flag[2] == 1);
          auVar134._12_4_ = 0xffffffff;
          in_XMM0_Da = (float)axes_flag[1];
          goto LAB_00135b48;
        }
        auVar134 = (undefined1  [16])0x0;
      }
    }
    reduce_c = false;
  }
  else {
    reduce_c = true;
    auVar134 = _DAT_0016f060;
  }
LAB_00135b48:
  lVar33 = auVar134._8_8_;
  uVar13 = this->operation;
  if (10 < (ulong)uVar13) {
    return 0;
  }
  uVar12 = 0x16f090;
  iVar9 = (&switchD_00135b66::switchdataD_0016f090)[uVar13] + 0x16f090;
  lVar22 = auVar134._0_8_;
  bVar20 = auVar134[0];
  bVar8 = auVar134[8];
  uVar7 = auVar134._8_2_;
  switch(uVar13) {
  case 0:
    fVar35 = this->coeff;
    iVar11 = this->keepdims;
    auVar135._0_8_ = lVar22 << 0x3f;
    auVar135._8_8_ = lVar33 << 0x3f;
    uVar17 = movmskpd(0x16f090,auVar135);
    bVar8 = (byte)uVar17;
    bVar29 = false;
    goto LAB_001361d5;
  case 1:
    fVar35 = this->coeff;
    post_process = (undefined1)this->keepdims;
    auVar139._0_8_ = lVar22 << 0x3f;
    auVar139._8_8_ = lVar33 << 0x3f;
    uVar17 = movmskpd(0x16f090,auVar139);
    bVar8 = (byte)uVar17;
    goto LAB_00135d07;
  case 2:
    fVar35 = this->coeff;
    if (this->keepdims == 0) {
      auVar142._0_8_ = lVar22 << 0x3f;
      auVar142._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar142);
      pMVar26 = top_blob;
      iVar11 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar35,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
    }
    else {
      auVar137._0_8_ = lVar22 << 0x3f;
      auVar137._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar137);
      pMVar26 = top_blob;
      iVar11 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,fVar35,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
    }
    if (iVar11 != 0) {
      return -100;
    }
    if (ABS(fVar35 + -1.0) <= 1.1920929e-07) {
      return 0;
    }
    goto LAB_0013e527;
  case 3:
    if (iVar11 == 3) {
      auVar38._0_8_ = lVar22 << 0x3f;
      auVar38._8_8_ = lVar33 << 0x3f;
      uVar13 = movmskpd((int)pMVar19,auVar38);
      iVar9 = 1;
      uVar12 = 1;
      if ((uVar13 & 2) != 0) {
        uVar12 = bottom_blob->w;
      }
      if ((uVar13 & 1) != 0) {
        iVar9 = bottom_blob->h;
      }
      iVar9 = iVar9 * uVar12;
      if (reduce_c != false) {
        iVar9 = iVar9 * bottom_blob->c;
      }
    }
    else if (iVar11 == 2) {
      auVar37._0_8_ = lVar22 << 0x3f;
      auVar37._8_8_ = lVar33 << 0x3f;
      uVar12 = movmskpd(0x16f090,auVar37);
      iVar9 = 1;
      if ((uVar12 & 2) != 0) {
        iVar9 = bottom_blob->w;
      }
      if ((uVar12 & 1) != 0) {
        iVar9 = iVar9 * bottom_blob->h;
      }
    }
    else {
      iVar9 = 1;
      if (iVar11 == 1) {
        iVar9 = bottom_blob->w;
      }
    }
    in_XMM1._0_4_ = (float)iVar9;
    fVar35 = this->coeff / in_XMM1._0_4_;
    iVar11 = this->keepdims;
    auVar144._0_8_ = lVar22 << 0x3f;
    auVar144._8_8_ = lVar33 << 0x3f;
    uVar17 = movmskpd(uVar12,auVar144);
    bVar8 = (byte)uVar17;
    bVar29 = true;
LAB_001361d5:
    iVar11 = reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar35,(bool)(bVar8 >> 1),(bool)(bVar8 & 1),reduce_c,
                        bVar29,in_XMM1._0_4_,iVar11,opt);
    return iVar11;
  case 4:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        uVar12 = bottom_blob->h;
        pMVar19 = (Mat *)(long)(int)uVar12;
        auVar46._8_4_ = 0xffffffff;
        auVar46._0_8_ = 0xffffffffffffffff;
        auVar46._12_4_ = 0xffffffff;
        auVar47._0_8_ = SUB168(auVar46 ^ auVar134,0) << 0x3f;
        auVar47._8_8_ = SUB168(auVar46 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar47);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar12 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar15 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar15 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar27;
            }
            pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar12 != 0) && (pMVar15 != (Mat *)0x0)) {
            if ((int)uVar12 < 1) {
              fVar36 = -3.4028235e+38;
            }
            else {
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
              pMVar27 = (Mat *)0x0;
              do {
                auVar119 = ZEXT816(0xff7fffff);
                if (0 < (int)uVar13) {
                  pMVar28 = (Mat *)0x0;
                  auVar119 = ZEXT816(0xff7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                    if (auVar119._0_4_ <= fVar36) {
                      auVar119._0_4_ = fVar36;
                    }
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar14 != pMVar28);
                }
                *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar119._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
              } while (pMVar27 != pMVar19);
              fVar36 = -3.4028235e+38;
              pMVar14 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
                if (fVar36 <= fVar1) {
                  fVar36 = fVar1;
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              } while (pMVar19 != pMVar14);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                bVar29 = false;
                pMVar26 = pMVar15;
                goto LAB_0013a61e;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
              }
            }
          }
          bVar29 = false;
        }
        else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar26 = (Mat *)(ulong)uVar12;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          if ((int)uVar12 < 1) {
            bVar29 = false;
            in_R9D = 0;
          }
          else {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              auVar113 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                auVar113 = ZEXT816(0xff7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  if (auVar113._0_4_ <= fVar36) {
                    auVar113._0_4_ = fVar36;
                  }
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar113._0_4_;
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
LAB_00137b40:
            bVar29 = false;
            in_R9D = 0;
          }
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
          auVar225 = _DAT_0016ed80;
          auVar52 = _DAT_0016ed70;
          auVar60 = _DAT_0016ebc0;
          uVar25 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar25) {
            pvVar34 = top_blob->data;
            lVar33 = (ulong)uVar25 - 1;
            auVar57._8_4_ = (int)lVar33;
            auVar57._0_8_ = lVar33;
            auVar57._12_4_ = (int)((ulong)lVar33 >> 0x20);
            uVar23 = 0;
            auVar57 = auVar57 ^ _DAT_0016ebc0;
            do {
              auVar154._8_4_ = (int)uVar23;
              auVar154._0_8_ = uVar23;
              auVar154._12_4_ = (int)(uVar23 >> 0x20);
              auVar220 = (auVar154 | auVar225) ^ auVar60;
              iVar9 = auVar57._4_4_;
              iVar10 = auVar57._12_4_;
              if ((bool)(~(auVar220._4_4_ == iVar9 && auVar57._0_4_ < auVar220._0_4_ ||
                          iVar9 < auVar220._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0xff7fffff;
              }
              if ((auVar220._12_4_ != iVar10 || auVar220._8_4_ <= auVar57._8_4_) &&
                  auVar220._12_4_ <= iVar10) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0xff7fffff;
              }
              auVar220 = (auVar154 | auVar52) ^ auVar60;
              auVar222._0_4_ = -(uint)(auVar57._0_4_ < auVar220._0_4_);
              auVar222._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
              auVar222._8_4_ = -(uint)(auVar57._8_4_ < auVar220._8_4_);
              auVar222._12_4_ = -(uint)(iVar10 < auVar220._12_4_);
              iVar9 = -(uint)(auVar220._4_4_ == iVar9);
              iVar10 = -(uint)(auVar220._12_4_ == iVar10);
              auVar238._4_4_ = iVar9;
              auVar238._0_4_ = iVar9;
              auVar238._8_4_ = iVar10;
              auVar238._12_4_ = iVar10;
              auVar155._4_4_ = auVar222._4_4_;
              auVar155._0_4_ = auVar222._4_4_;
              auVar155._8_4_ = auVar222._12_4_;
              auVar155._12_4_ = auVar222._12_4_;
              auVar156._8_4_ = 0xffffffff;
              auVar156._0_8_ = 0xffffffffffffffff;
              auVar156._12_4_ = 0xffffffff;
              auVar156 = (auVar155 | auVar238 & auVar222) ^ auVar156;
              if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0xff7fffff;
              }
              pMVar26 = (Mat *)(ulong)auVar156._8_2_;
              if ((auVar156 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0xff7fffff;
              }
              uVar23 = uVar23 + 4;
            } while ((uVar25 + 3 & 0xfffffffc) != uVar23);
          }
          if (0 < (int)uVar12) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  fVar36 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                  if (fVar1 <= fVar36) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar31 + (long)pMVar15 * 4) = fVar1;
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
            goto LAB_00137b40;
          }
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          bVar29 = true;
        }
LAB_0013a61e:
        if (!bVar29) goto LAB_0013e45e;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) goto LAB_0013631b;
        fVar36 = -3.4028235e+38;
        lVar33 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar33 * 4);
          if (fVar36 <= fVar1) {
            fVar36 = fVar1;
          }
          lVar33 = lVar33 + 1;
        } while (iVar11 != lVar33);
        goto LAB_00136323;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        lVar33 = (long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        uVar25 = bottom_blob->c;
        pMVar19 = (Mat *)(long)(int)uVar25;
        uVar21 = uVar12 * uVar13;
        auVar77._8_4_ = 0xffffffff;
        auVar77._0_8_ = 0xffffffffffffffff;
        auVar77._12_4_ = 0xffffffff;
        auVar78._0_8_ = SUB168(auVar77 ^ auVar134,0) << 0x3f;
        auVar78._8_8_ = SUB168(auVar77 ^ auVar134,8) << 0x3f;
        iVar11 = movmskpd(uVar21,auVar78);
        bVar16 = reduce_c ^ 1;
        if (iVar11 == 0 && bVar16 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar25 == 0) {
            pMVar14 = (Mat *)0x0;
            pbVar18 = (bool *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar15 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar11 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
              pMVar14 = (Mat *)ptr;
              if (iVar11 != 0) {
                ptr = (void *)0x0;
                pMVar14 = (Mat *)ptr;
              }
            }
            else {
              pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar15;
            }
            pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
            *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar25 != 0) && (pMVar14 != (Mat *)0x0)) {
            if ((int)uVar25 < 1) {
              fVar36 = -3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar26 = (Mat *)bottom_blob->data;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = -3.4028235e+38;
                if (0 < (int)uVar21) {
                  uVar23 = 0;
                  fVar36 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                    if (fVar36 <= fVar1) {
                      fVar36 = fVar1;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar21 != uVar23);
                }
                *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
              fVar36 = -3.4028235e+38;
              pMVar15 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
                if (fVar36 <= fVar1) {
                  fVar36 = fVar1;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar19 != pMVar15);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 == (Allocator *)0x0) {
                if (pMVar14 != (Mat *)0x0) {
                  free(pMVar14);
                }
              }
              else {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                pMVar26 = pMVar14;
              }
            }
          }
LAB_0013e452:
          bVar29 = false;
        }
        else {
          if (iVar11 == 0 && reduce_c == false) {
            pMVar26 = (Mat *)(ulong)uVar25;
            Mat::create(top_blob,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(ulong)uVar21;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = -3.4028235e+38;
                if (0 < (int)uVar21) {
                  pMVar15 = (Mat *)0x0;
                  fVar36 = -3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                    if (fVar36 <= fVar1) {
                      fVar36 = fVar1;
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar26 != pMVar15);
                }
                *(float *)((long)pvVar31 + (long)pMVar14 * 4) = fVar36;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar14 != pMVar19);
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar13;
            bVar24 = (byte)iVar11 >> 1 | bVar20;
            if (reduce_c != false || (bVar24 & 1) != 0) {
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)0x1;
                Mat::create((Mat *)&ptr,1,uVar12,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar86._8_4_ = (int)lVar22;
                      auVar86._0_8_ = lVar22;
                      auVar86._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar86 = auVar86 ^ _DAT_0016ebc0;
                      do {
                        auVar181._8_4_ = (int)pMVar26;
                        auVar181._0_8_ = pMVar26;
                        auVar181._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar181 | auVar52) ^ auVar134;
                        iVar11 = auVar86._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar86._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0xff7fffff;
                        }
                        if ((auVar225._12_4_ != auVar86._12_4_ || auVar225._8_4_ <= auVar86._8_4_)
                            && auVar225._12_4_ <= auVar86._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0xff7fffff;
                        }
                        auVar225 = (auVar181 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar86._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0xff7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0xff7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          pvVar31 = pvVar34;
                          do {
                            auVar131 = ZEXT816(0xff7fffff);
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              auVar131 = ZEXT816(0xff7fffff);
                              do {
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (auVar131._0_4_ <= fVar36) {
                                  auVar131._0_4_ = fVar36;
                                }
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            *(int *)((long)ptr +
                                    uVar32 * 4 +
                                    CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15)
                                 = auVar131._0_4_;
                            uVar32 = uVar32 + 1;
                            pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                          } while (uVar32 != uVar23);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar87._8_4_ = (int)lVar33;
                      auVar87._0_8_ = lVar33;
                      auVar87._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar32 = 0;
                      auVar87 = auVar87 ^ _DAT_0016ebc0;
                      do {
                        auVar182._8_4_ = (int)uVar32;
                        auVar182._0_8_ = uVar32;
                        auVar182._12_4_ = (int)(uVar32 >> 0x20);
                        auVar225 = (auVar182 | auVar52) ^ auVar134;
                        iVar11 = auVar87._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar87._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0xff7fffff;
                        }
                        if ((auVar225._12_4_ != auVar87._12_4_ || auVar225._8_4_ <= auVar87._8_4_)
                            && auVar225._12_4_ <= auVar87._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0xff7fffff;
                        }
                        auVar225 = (auVar182 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar87._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0xff7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0xff7fffff;
                        }
                        uVar32 = uVar32 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + uVar32 * 4);
                            fVar36 = *(float *)((long)pvVar34 + uVar32 * 4);
                            if (fVar1 <= fVar36) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + uVar32 * 4) = fVar1;
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                goto LAB_0013e452;
              }
              pMVar26 = (Mat *)(ulong)uVar7;
              bVar24 = (byte)iVar11 | bVar8;
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create((Mat *)&ptr,uVar13,1,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar98._8_4_ = (int)lVar22;
                      auVar98._0_8_ = lVar22;
                      auVar98._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar98 = auVar98 ^ _DAT_0016ebc0;
                      do {
                        auVar193._8_4_ = (int)pMVar26;
                        auVar193._0_8_ = pMVar26;
                        auVar193._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar193 | auVar52) ^ auVar134;
                        iVar11 = auVar98._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar98._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0xff7fffff;
                        }
                        if ((auVar225._12_4_ != auVar98._12_4_ || auVar225._8_4_ <= auVar98._8_4_)
                            && auVar225._12_4_ <= auVar98._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0xff7fffff;
                        }
                        auVar225 = (auVar193 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar98._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0xff7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0xff7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar21 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar1 <= fVar36) {
                                  fVar1 = fVar36;
                                }
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar21 = uVar21 + 1;
                            pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                          } while (uVar21 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 +
                                          CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar12 - 1;
                      auVar99._8_4_ = (int)lVar33;
                      auVar99._0_8_ = lVar33;
                      auVar99._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar99 = auVar99 ^ _DAT_0016ebc0;
                      do {
                        auVar194._8_4_ = (int)uVar23;
                        auVar194._0_8_ = uVar23;
                        auVar194._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar194 | auVar52) ^ auVar134;
                        iVar11 = auVar99._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar99._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0xff7fffff;
                        }
                        if ((auVar225._12_4_ != auVar99._12_4_ || auVar225._8_4_ <= auVar99._8_4_)
                            && auVar225._12_4_ <= auVar99._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0xff7fffff;
                        }
                        auVar225 = (auVar194 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar99._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0xff7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0xff7fffff;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                            fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                            if (fVar1 <= fVar36) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + (long)pMVar15 * 4) = fVar1;
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                bVar29 = false;
              }
              else if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,uVar12,sVar2,opt->blob_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                uVar13 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar13) {
                  pvVar34 = top_blob->data;
                  lVar33 = (ulong)uVar13 - 1;
                  auVar107._8_4_ = (int)lVar33;
                  auVar107._0_8_ = lVar33;
                  auVar107._12_4_ = (int)((ulong)lVar33 >> 0x20);
                  uVar23 = 0;
                  auVar107 = auVar107 ^ _DAT_0016ebc0;
                  do {
                    auVar208._8_4_ = (int)uVar23;
                    auVar208._0_8_ = uVar23;
                    auVar208._12_4_ = (int)(uVar23 >> 0x20);
                    auVar225 = (auVar208 | auVar52) ^ auVar134;
                    iVar11 = auVar107._4_4_;
                    iVar9 = auVar107._12_4_;
                    if ((bool)(~(auVar225._4_4_ == iVar11 && auVar107._0_4_ < auVar225._0_4_ ||
                                iVar11 < auVar225._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0xff7fffff;
                    }
                    if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar107._8_4_) &&
                        auVar225._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0xff7fffff;
                    }
                    auVar225 = (auVar208 | auVar60) ^ auVar134;
                    auVar232._0_4_ = -(uint)(auVar107._0_4_ < auVar225._0_4_);
                    auVar232._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                    auVar232._8_4_ = -(uint)(auVar107._8_4_ < auVar225._8_4_);
                    auVar232._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                    iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                    iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                    auVar247._4_4_ = iVar11;
                    auVar247._0_4_ = iVar11;
                    auVar247._8_4_ = iVar9;
                    auVar247._12_4_ = iVar9;
                    auVar209._4_4_ = auVar232._4_4_;
                    auVar209._0_4_ = auVar232._4_4_;
                    auVar209._8_4_ = auVar232._12_4_;
                    auVar209._12_4_ = auVar232._12_4_;
                    auVar210._8_4_ = 0xffffffff;
                    auVar210._0_8_ = 0xffffffffffffffff;
                    auVar210._12_4_ = 0xffffffff;
                    auVar210 = (auVar209 | auVar247 & auVar232) ^ auVar210;
                    if ((auVar210 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0xff7fffff;
                    }
                    pMVar14 = (Mat *)(ulong)auVar210._8_2_;
                    if ((auVar210 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0xff7fffff;
                    }
                    uVar23 = uVar23 + 4;
                  } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
                }
                pMVar26 = pMVar14;
                if ((int)uVar25 < 1) goto LAB_0013a9eb;
                sVar2 = bottom_blob->elemsize;
                sVar3 = bottom_blob->cstep;
                pvVar34 = bottom_blob->data;
                pMVar26 = (Mat *)top_blob->data;
                pMVar14 = (Mat *)0x0;
                in_R9D = 0;
                do {
                  if (0 < (int)uVar21) {
                    uVar23 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                      fVar36 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                      if (fVar1 <= fVar36) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)&pMVar26->data + uVar23 * 4) = fVar1;
                      uVar23 = uVar23 + 1;
                    } while (uVar21 != uVar23);
                  }
                  pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                  bVar29 = false;
                } while (pMVar14 != pMVar19);
              }
              else {
                bVar29 = true;
                if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar26 = (Mat *)(ulong)uVar13;
                  Mat::create(top_blob,uVar13,uVar25,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_0016ed80;
                  auVar60 = _DAT_0016ed70;
                  auVar134 = _DAT_0016ebc0;
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar21) {
                    pvVar34 = top_blob->data;
                    lVar33 = (ulong)uVar21 - 1;
                    auVar79._8_4_ = (int)lVar33;
                    auVar79._0_8_ = lVar33;
                    auVar79._12_4_ = (int)((ulong)lVar33 >> 0x20);
                    uVar23 = 0;
                    auVar79 = auVar79 ^ _DAT_0016ebc0;
                    do {
                      auVar172._8_4_ = (int)uVar23;
                      auVar172._0_8_ = uVar23;
                      auVar172._12_4_ = (int)(uVar23 >> 0x20);
                      auVar225 = (auVar172 | auVar52) ^ auVar134;
                      iVar11 = auVar79._4_4_;
                      iVar9 = auVar79._12_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar11 && auVar79._0_4_ < auVar225._0_4_ ||
                                  iVar11 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0xff7fffff;
                      }
                      if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar79._8_4_) &&
                          auVar225._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0xff7fffff;
                      }
                      auVar225 = (auVar172 | auVar60) ^ auVar134;
                      auVar226._0_4_ = -(uint)(auVar79._0_4_ < auVar225._0_4_);
                      auVar226._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                      auVar226._8_4_ = -(uint)(auVar79._8_4_ < auVar225._8_4_);
                      auVar226._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                      iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                      iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                      auVar241._4_4_ = iVar11;
                      auVar241._0_4_ = iVar11;
                      auVar241._8_4_ = iVar9;
                      auVar241._12_4_ = iVar9;
                      auVar173._4_4_ = auVar226._4_4_;
                      auVar173._0_4_ = auVar226._4_4_;
                      auVar173._8_4_ = auVar226._12_4_;
                      auVar173._12_4_ = auVar226._12_4_;
                      auVar174._8_4_ = 0xffffffff;
                      auVar174._0_8_ = 0xffffffffffffffff;
                      auVar174._12_4_ = 0xffffffff;
                      auVar174 = (auVar173 | auVar241 & auVar226) ^ auVar174;
                      if ((auVar174 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0xff7fffff;
                      }
                      pMVar26 = (Mat *)(ulong)auVar174._8_2_;
                      if ((auVar174 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0xff7fffff;
                      }
                      uVar23 = uVar23 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar23);
                  }
                  if ((int)uVar25 < 1) goto LAB_0013a9eb;
                  pvVar34 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar26 = (Mat *)top_blob->data;
                  iVar11 = top_blob->w;
                  sVar3 = top_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  in_R9D = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar25 = 0;
                      pvVar31 = pvVar34;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                            fVar36 = *(float *)((long)&pMVar26->data + (long)pMVar27 * 4);
                            if (fVar1 <= fVar36) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)&pMVar26->data + (long)pMVar27 * 4) = fVar1;
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar14 != pMVar27);
                        }
                        uVar25 = uVar25 + 1;
                        pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar13 * 4);
                      } while (uVar25 != uVar12);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar4);
                    pMVar26 = (Mat *)((long)&pMVar26->data + (long)iVar11 * sVar3);
                    bVar29 = false;
                  } while (pMVar15 != pMVar19);
                }
              }
              goto LAB_0013e456;
            }
            pMVar26 = (Mat *)(ulong)uVar12;
            Mat::create(top_blob,uVar12,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar12) {
                  uVar32 = 0;
                  pvVar30 = pvVar34;
                  do {
                    auVar128 = ZEXT816(0xff7fffff);
                    if (0 < (int)uVar13) {
                      pMVar27 = (Mat *)0x0;
                      auVar128 = ZEXT816(0xff7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                        if (auVar128._0_4_ <= fVar36) {
                          auVar128._0_4_ = fVar36;
                        }
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                         auVar128._0_4_;
                    uVar32 = uVar32 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                  } while (uVar32 != uVar23);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
            }
          }
LAB_0013a9eb:
          bVar29 = false;
          in_R9D = 0;
        }
        goto LAB_0013e456;
      }
LAB_0013e45b:
      in_R9D = 0;
    }
    else if (iVar11 == 2) {
      uVar13 = bottom_blob->w;
      pMVar14 = (Mat *)(ulong)uVar13;
      iVar10 = bottom_blob->h;
      pMVar19 = (Mat *)(long)iVar10;
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar40._0_8_ = SUB168(auVar39 ^ auVar134,0) << 0x3f;
      auVar40._8_8_ = SUB168(auVar39 ^ auVar134,8) << 0x3f;
      iVar9 = movmskpd(iVar9,auVar40);
      if (iVar9 == 0) {
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
        pAVar6 = opt->workspace_allocator;
        if (iVar10 == 0) {
          pbVar18 = (bool *)0x0;
          pMVar15 = (Mat *)0x0;
        }
        else {
          uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
          pMVar27 = (Mat *)(uVar23 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar26 = (Mat *)0x10;
            iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
            pMVar15 = (Mat *)ptr;
            if (iVar9 != 0) {
              ptr = (void *)0x0;
              pMVar15 = (Mat *)ptr;
            }
          }
          else {
            pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar26 = pMVar27;
          }
          pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
          *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
        }
        in_R9D = 0xffffff9c;
        if ((iVar10 != 0) && (pMVar15 != (Mat *)0x0)) {
          if (iVar10 < 1) {
            fVar36 = -3.4028235e+38;
          }
          else {
            pvVar34 = bottom_blob->data;
            pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
            pMVar27 = (Mat *)0x0;
            do {
              auVar116 = ZEXT816(0xff7fffff);
              if (0 < (int)uVar13) {
                pMVar28 = (Mat *)0x0;
                auVar116 = ZEXT816(0xff7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                  if (auVar116._0_4_ <= fVar36) {
                    auVar116._0_4_ = fVar36;
                  }
                  pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                } while (pMVar14 != pMVar28);
              }
              *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar116._0_4_;
              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
            } while (pMVar27 != pMVar19);
            fVar36 = -3.4028235e+38;
            pMVar14 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
              if (fVar36 <= fVar1) {
                fVar36 = fVar1;
              }
              pMVar14 = (Mat *)((long)&pMVar14->data + 1);
            } while (pMVar19 != pMVar14);
          }
          *(float *)top_blob->data = fVar36;
          in_R9D = 0;
        }
        if (pbVar18 != (bool *)0x0) {
          LOCK();
          *(int *)pbVar18 = *(int *)pbVar18 + -1;
          UNLOCK();
          if (*(int *)pbVar18 == 0) {
            if (pAVar6 != (Allocator *)0x0) {
              (**(code **)(*(long *)pAVar6 + 0x18))();
              bVar29 = false;
              pMVar26 = pMVar15;
              goto LAB_001382f7;
            }
            if (pMVar15 != (Mat *)0x0) {
              free(pMVar15);
            }
          }
        }
        bVar29 = false;
      }
      else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,iVar10,sVar2,opt->blob_allocator);
        if (iVar10 < 1) {
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          pvVar34 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          pvVar31 = top_blob->data;
          sVar3 = bottom_blob->elemsize;
          pMVar26 = (Mat *)0x0;
          do {
            auVar110 = ZEXT816(0xff7fffff);
            if (0 < (int)uVar13) {
              pMVar15 = (Mat *)0x0;
              auVar110 = ZEXT816(0xff7fffff);
              do {
                fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                if (auVar110._0_4_ <= fVar36) {
                  auVar110._0_4_ = fVar36;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar14 != pMVar15);
            }
            *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar110._0_4_;
            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
            pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
          } while (pMVar26 != pMVar19);
LAB_00136fd8:
          bVar29 = false;
          in_R9D = 0;
        }
      }
      else if (((bVar8 | (byte)iVar9) & 1) == 0) {
        pMVar26 = pMVar14;
        Mat::create(top_blob,uVar13,1,sVar2,opt->blob_allocator);
        auVar225 = _DAT_0016ed80;
        auVar52 = _DAT_0016ed70;
        auVar60 = _DAT_0016ebc0;
        uVar12 = top_blob->c * (int)top_blob->cstep;
        if (0 < (int)uVar12) {
          pvVar34 = top_blob->data;
          lVar33 = (ulong)uVar12 - 1;
          auVar53._8_4_ = (int)lVar33;
          auVar53._0_8_ = lVar33;
          auVar53._12_4_ = (int)((ulong)lVar33 >> 0x20);
          uVar23 = 0;
          auVar53 = auVar53 ^ _DAT_0016ebc0;
          do {
            auVar145._8_4_ = (int)uVar23;
            auVar145._0_8_ = uVar23;
            auVar145._12_4_ = (int)(uVar23 >> 0x20);
            auVar220 = (auVar145 | auVar225) ^ auVar60;
            iVar9 = auVar53._4_4_;
            iVar217 = auVar53._12_4_;
            if ((bool)(~(auVar220._4_4_ == iVar9 && auVar53._0_4_ < auVar220._0_4_ ||
                        iVar9 < auVar220._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0xff7fffff;
            }
            if ((auVar220._12_4_ != iVar217 || auVar220._8_4_ <= auVar53._8_4_) &&
                auVar220._12_4_ <= iVar217) {
              *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0xff7fffff;
            }
            auVar220 = (auVar145 | auVar52) ^ auVar60;
            auVar218._0_4_ = -(uint)(auVar53._0_4_ < auVar220._0_4_);
            auVar218._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
            auVar218._8_4_ = -(uint)(auVar53._8_4_ < auVar220._8_4_);
            auVar218._12_4_ = -(uint)(iVar217 < auVar220._12_4_);
            iVar9 = -(uint)(auVar220._4_4_ == iVar9);
            iVar217 = -(uint)(auVar220._12_4_ == iVar217);
            auVar235._4_4_ = iVar9;
            auVar235._0_4_ = iVar9;
            auVar235._8_4_ = iVar217;
            auVar235._12_4_ = iVar217;
            auVar146._4_4_ = auVar218._4_4_;
            auVar146._0_4_ = auVar218._4_4_;
            auVar146._8_4_ = auVar218._12_4_;
            auVar146._12_4_ = auVar218._12_4_;
            auVar147._8_4_ = 0xffffffff;
            auVar147._0_8_ = 0xffffffffffffffff;
            auVar147._12_4_ = 0xffffffff;
            auVar147 = (auVar146 | auVar235 & auVar218) ^ auVar147;
            if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0xff7fffff;
            }
            pMVar26 = (Mat *)(ulong)auVar147._8_2_;
            if ((auVar147 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0xff7fffff;
            }
            uVar23 = uVar23 + 4;
          } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
        }
        if (0 < iVar10) {
          pvVar34 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          pvVar31 = top_blob->data;
          sVar3 = bottom_blob->elemsize;
          pMVar26 = (Mat *)0x0;
          do {
            if (0 < (int)uVar13) {
              pMVar15 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                fVar36 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                if (fVar1 <= fVar36) {
                  fVar1 = fVar36;
                }
                *(float *)((long)pvVar31 + (long)pMVar15 * 4) = fVar1;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar14 != pMVar15);
            }
            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
            pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
          } while (pMVar26 != pMVar19);
          goto LAB_00136fd8;
        }
        bVar29 = false;
        in_R9D = 0;
      }
      else {
        bVar29 = true;
      }
LAB_001382f7:
      if (bVar29) goto LAB_001382ff;
    }
    else {
      if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) {
LAB_0013631b:
          fVar36 = -3.4028235e+38;
        }
        else {
          fVar36 = -3.4028235e+38;
          lVar33 = 0;
          do {
            fVar1 = *(float *)((long)bottom_blob->data + lVar33 * 4);
            if (fVar36 <= fVar1) {
              fVar36 = fVar1;
            }
            lVar33 = lVar33 + 1;
          } while (iVar11 != lVar33);
        }
LAB_00136323:
        *(float *)top_blob->data = fVar36;
        goto LAB_0013e45b;
      }
LAB_001382ff:
      if (iVar11 != 3) goto LAB_0013e45b;
      uVar13 = bottom_blob->w;
      lVar33 = (long)(int)uVar13;
      uVar12 = bottom_blob->h;
      uVar23 = (ulong)uVar12;
      iVar11 = bottom_blob->c;
      pMVar19 = (Mat *)(long)iVar11;
      uVar25 = uVar12 * uVar13;
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar62._0_8_ = SUB168(auVar61 ^ auVar134,0) << 0x3f;
      auVar62._8_8_ = SUB168(auVar61 ^ auVar134,8) << 0x3f;
      iVar9 = movmskpd(uVar25,auVar62);
      bVar16 = reduce_c ^ 1;
      if (iVar9 == 0 && bVar16 == 0) {
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
        pAVar6 = opt->workspace_allocator;
        if (iVar11 == 0) {
          pMVar14 = (Mat *)0x0;
          pbVar18 = (bool *)0x0;
        }
        else {
          uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
          pMVar15 = (Mat *)(uVar23 + 4);
          if (pAVar6 == (Allocator *)0x0) {
            ptr = (void *)0x0;
            pMVar26 = (Mat *)0x10;
            iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
            pMVar14 = (Mat *)ptr;
            if (iVar9 != 0) {
              ptr = (void *)0x0;
              pMVar14 = (Mat *)ptr;
            }
          }
          else {
            pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
            pMVar26 = pMVar15;
          }
          pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
          *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
        }
        in_R9D = 0xffffff9c;
        if ((iVar11 != 0) && (pMVar14 != (Mat *)0x0)) {
          if (iVar11 < 1) {
            fVar36 = -3.4028235e+38;
          }
          else {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pMVar26 = (Mat *)bottom_blob->data;
            pMVar15 = (Mat *)0x0;
            do {
              fVar36 = -3.4028235e+38;
              if (0 < (int)uVar25) {
                uVar23 = 0;
                fVar36 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                  if (fVar36 <= fVar1) {
                    fVar36 = fVar1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
            } while (pMVar15 != pMVar19);
            fVar36 = -3.4028235e+38;
            pMVar15 = (Mat *)0x0;
            do {
              fVar1 = *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
              if (fVar36 <= fVar1) {
                fVar36 = fVar1;
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            } while (pMVar19 != pMVar15);
          }
          *(float *)top_blob->data = fVar36;
          in_R9D = 0;
        }
        if (pbVar18 != (bool *)0x0) {
          LOCK();
          *(int *)pbVar18 = *(int *)pbVar18 + -1;
          UNLOCK();
          if (*(int *)pbVar18 == 0) {
            if (pAVar6 == (Allocator *)0x0) {
              if (pMVar14 != (Mat *)0x0) {
                free(pMVar14);
              }
            }
            else {
              (**(code **)(*(long *)pAVar6 + 0x18))();
              pMVar26 = pMVar14;
            }
          }
        }
LAB_0013d2eb:
        bVar29 = false;
      }
      else {
        if (iVar9 == 0 && reduce_c == false) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,iVar11,sVar2,opt->blob_allocator);
          if (0 < iVar11) {
            pvVar34 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar31 = top_blob->data;
            pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
            sVar3 = bottom_blob->cstep;
            pMVar14 = (Mat *)0x0;
            do {
              fVar36 = -3.4028235e+38;
              if (0 < (int)uVar25) {
                uVar23 = 0;
                fVar36 = -3.4028235e+38;
                do {
                  fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                  if (fVar36 <= fVar1) {
                    fVar36 = fVar1;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              *(float *)((long)pvVar31 + (long)pMVar26 * (long)pMVar14) = fVar36;
              pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
            } while (pMVar14 != pMVar19);
          }
        }
        else {
          pMVar14 = (Mat *)(ulong)uVar13;
          bVar24 = (byte)iVar9 >> 1 | bVar20;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,1,uVar12,1,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68._0_16_ = (undefined1  [16])0x0;
              pMVar26 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar12,iVar11,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_0016ed80;
              auVar60 = _DAT_0016ed70;
              auVar134 = _DAT_0016ebc0;
              in_R9D = 0xffffff9c;
              if (ptr != (void *)0x0) {
                pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar26 != 0) {
                  uVar25 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar25) {
                    lVar22 = (ulong)uVar25 - 1;
                    auVar71._8_4_ = (int)lVar22;
                    auVar71._0_8_ = lVar22;
                    auVar71._12_4_ = (int)((ulong)lVar22 >> 0x20);
                    pMVar26 = (Mat *)0x0;
                    auVar71 = auVar71 ^ _DAT_0016ebc0;
                    do {
                      auVar166._8_4_ = (int)pMVar26;
                      auVar166._0_8_ = pMVar26;
                      auVar166._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                      auVar225 = (auVar166 | auVar52) ^ auVar134;
                      iVar9 = auVar71._4_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar9 && auVar71._0_4_ < auVar225._0_4_ ||
                                  iVar9 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0xff7fffff;
                      }
                      if ((auVar225._12_4_ != auVar71._12_4_ || auVar225._8_4_ <= auVar71._8_4_) &&
                          auVar225._12_4_ <= auVar71._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0xff7fffff;
                      }
                      auVar225 = (auVar166 | auVar60) ^ auVar134;
                      iVar10 = auVar225._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar71._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0xff7fffff;
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                    } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                  }
                  if (0 < iVar11) {
                    pvVar34 = bottom_blob->data;
                    pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar32 = 0;
                        pvVar31 = pvVar34;
                        do {
                          auVar125 = ZEXT816(0xff7fffff);
                          if (0 < (int)uVar13) {
                            pMVar27 = (Mat *)0x0;
                            auVar125 = ZEXT816(0xff7fffff);
                            do {
                              fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                              if (auVar125._0_4_ <= fVar36) {
                                auVar125._0_4_ = fVar36;
                              }
                              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                            } while (pMVar14 != pMVar27);
                          }
                          *(int *)((long)ptr +
                                  uVar32 * 4 +
                                  CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15) =
                               auVar125._0_4_;
                          uVar32 = uVar32 + 1;
                          pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                        } while (uVar32 != uVar23);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                    } while (pMVar15 != pMVar19);
                  }
                  auVar52 = _DAT_0016ed80;
                  auVar60 = _DAT_0016ed70;
                  auVar134 = _DAT_0016ebc0;
                  uVar13 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar13) {
                    pMVar26 = (Mat *)top_blob->data;
                    lVar33 = (ulong)uVar13 - 1;
                    auVar72._8_4_ = (int)lVar33;
                    auVar72._0_8_ = lVar33;
                    auVar72._12_4_ = (int)((ulong)lVar33 >> 0x20);
                    uVar32 = 0;
                    auVar72 = auVar72 ^ _DAT_0016ebc0;
                    do {
                      auVar167._8_4_ = (int)uVar32;
                      auVar167._0_8_ = uVar32;
                      auVar167._12_4_ = (int)(uVar32 >> 0x20);
                      auVar225 = (auVar167 | auVar52) ^ auVar134;
                      iVar9 = auVar72._4_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar9 && auVar72._0_4_ < auVar225._0_4_ ||
                                  iVar9 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0xff7fffff;
                      }
                      if ((auVar225._12_4_ != auVar72._12_4_ || auVar225._8_4_ <= auVar72._8_4_) &&
                          auVar225._12_4_ <= auVar72._12_4_) {
                        *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0xff7fffff;
                      }
                      auVar225 = (auVar167 | auVar60) ^ auVar134;
                      iVar10 = auVar225._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar72._0_4_)) {
                        *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0xff7fffff;
                        *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0xff7fffff;
                      }
                      uVar32 = uVar32 + 4;
                    } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                  }
                  if (0 < iVar11) {
                    pvVar34 = top_blob->data;
                    pMVar26 = (Mat *)0x0;
                    pvVar31 = ptr;
                    do {
                      if (0 < (int)uVar12) {
                        uVar32 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + uVar32 * 4);
                          fVar36 = *(float *)((long)pvVar34 + uVar32 * 4);
                          if (fVar1 <= fVar36) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar34 + uVar32 * 4) = fVar1;
                          uVar32 = uVar32 + 1;
                        } while (uVar23 != uVar32);
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                      pvVar31 = (void *)((long)pvVar31 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar26 != pMVar19);
                  }
                  in_R9D = 0;
                }
              }
LAB_0013d2e1:
              Mat::~Mat((Mat *)&ptr);
              goto LAB_0013d2eb;
            }
            pMVar26 = (Mat *)(ulong)uVar7;
            bVar24 = (byte)iVar9 | bVar8;
            if ((bVar24 & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,uVar13,1,1,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = (undefined1  [16])0x0;
              local_68._0_16_ = (undefined1  [16])0x0;
              pMVar26 = (Mat *)(ulong)uVar13;
              Mat::create((Mat *)&ptr,uVar13,1,iVar11,sVar2,opt->workspace_allocator);
              auVar52 = _DAT_0016ed80;
              auVar60 = _DAT_0016ed70;
              auVar134 = _DAT_0016ebc0;
              in_R9D = 0xffffff9c;
              if (ptr != (void *)0x0) {
                pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                if (local_68._8_8_ * (long)pMVar26 != 0) {
                  uVar25 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar25) {
                    lVar22 = (ulong)uVar25 - 1;
                    auVar92._8_4_ = (int)lVar22;
                    auVar92._0_8_ = lVar22;
                    auVar92._12_4_ = (int)((ulong)lVar22 >> 0x20);
                    pMVar26 = (Mat *)0x0;
                    auVar92 = auVar92 ^ _DAT_0016ebc0;
                    do {
                      auVar187._8_4_ = (int)pMVar26;
                      auVar187._0_8_ = pMVar26;
                      auVar187._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                      auVar225 = (auVar187 | auVar52) ^ auVar134;
                      iVar9 = auVar92._4_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar9 && auVar92._0_4_ < auVar225._0_4_ ||
                                  iVar9 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0xff7fffff;
                      }
                      if ((auVar225._12_4_ != auVar92._12_4_ || auVar225._8_4_ <= auVar92._8_4_) &&
                          auVar225._12_4_ <= auVar92._12_4_) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0xff7fffff;
                      }
                      auVar225 = (auVar187 | auVar60) ^ auVar134;
                      iVar10 = auVar225._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar92._0_4_)) {
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0xff7fffff;
                        *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0xff7fffff;
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                    } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                  }
                  if (0 < iVar11) {
                    pvVar34 = bottom_blob->data;
                    pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar15 = (Mat *)0x0;
                    pvVar31 = ptr;
                    do {
                      if (0 < (int)uVar12) {
                        uVar25 = 0;
                        pvVar30 = pvVar34;
                        do {
                          if (0 < (int)uVar13) {
                            pMVar27 = (Mat *)0x0;
                            do {
                              fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                              fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                              if (fVar1 <= fVar36) {
                                fVar1 = fVar36;
                              }
                              *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                              pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                            } while (pMVar14 != pMVar27);
                          }
                          uVar25 = uVar25 + 1;
                          pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                        } while (uVar25 != uVar12);
                      }
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      pvVar31 = (void *)((long)pvVar31 +
                                        CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                    } while (pMVar15 != pMVar19);
                  }
                  auVar52 = _DAT_0016ed80;
                  auVar60 = _DAT_0016ed70;
                  auVar134 = _DAT_0016ebc0;
                  uVar12 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar12) {
                    pMVar26 = (Mat *)top_blob->data;
                    lVar33 = (ulong)uVar12 - 1;
                    auVar93._8_4_ = (int)lVar33;
                    auVar93._0_8_ = lVar33;
                    auVar93._12_4_ = (int)((ulong)lVar33 >> 0x20);
                    uVar23 = 0;
                    auVar93 = auVar93 ^ _DAT_0016ebc0;
                    do {
                      auVar188._8_4_ = (int)uVar23;
                      auVar188._0_8_ = uVar23;
                      auVar188._12_4_ = (int)(uVar23 >> 0x20);
                      auVar225 = (auVar188 | auVar52) ^ auVar134;
                      iVar9 = auVar93._4_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar9 && auVar93._0_4_ < auVar225._0_4_ ||
                                  iVar9 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0xff7fffff;
                      }
                      if ((auVar225._12_4_ != auVar93._12_4_ || auVar225._8_4_ <= auVar93._8_4_) &&
                          auVar225._12_4_ <= auVar93._12_4_) {
                        *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0xff7fffff;
                      }
                      auVar225 = (auVar188 | auVar60) ^ auVar134;
                      iVar10 = auVar225._4_4_;
                      if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar93._0_4_)) {
                        *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0xff7fffff;
                        *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0xff7fffff;
                      }
                      uVar23 = uVar23 + 4;
                    } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                  }
                  if (0 < iVar11) {
                    pvVar34 = top_blob->data;
                    pMVar26 = (Mat *)0x0;
                    pvVar31 = ptr;
                    do {
                      if (0 < (int)uVar13) {
                        pMVar15 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                          fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                          if (fVar1 <= fVar36) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar34 + (long)pMVar15 * 4) = fVar1;
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        } while (pMVar14 != pMVar15);
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                      pvVar31 = (void *)((long)pvVar31 +
                                        local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar26 != pMVar19);
                  }
                  in_R9D = 0;
                }
              }
              goto LAB_0013d2e1;
            }
            if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,uVar13,uVar12,1,sVar2,opt->blob_allocator);
              auVar52 = _DAT_0016ed80;
              auVar60 = _DAT_0016ed70;
              auVar134 = _DAT_0016ebc0;
              uVar13 = top_blob->c * (int)top_blob->cstep;
              if (0 < (int)uVar13) {
                pvVar34 = top_blob->data;
                lVar33 = (ulong)uVar13 - 1;
                auVar104._8_4_ = (int)lVar33;
                auVar104._0_8_ = lVar33;
                auVar104._12_4_ = (int)((ulong)lVar33 >> 0x20);
                uVar23 = 0;
                auVar104 = auVar104 ^ _DAT_0016ebc0;
                do {
                  auVar199._8_4_ = (int)uVar23;
                  auVar199._0_8_ = uVar23;
                  auVar199._12_4_ = (int)(uVar23 >> 0x20);
                  auVar225 = (auVar199 | auVar52) ^ auVar134;
                  iVar9 = auVar104._4_4_;
                  iVar10 = auVar104._12_4_;
                  if ((bool)(~(auVar225._4_4_ == iVar9 && auVar104._0_4_ < auVar225._0_4_ ||
                              iVar9 < auVar225._4_4_) & 1)) {
                    *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0xff7fffff;
                  }
                  if ((auVar225._12_4_ != iVar10 || auVar225._8_4_ <= auVar104._8_4_) &&
                      auVar225._12_4_ <= iVar10) {
                    *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0xff7fffff;
                  }
                  auVar225 = (auVar199 | auVar60) ^ auVar134;
                  auVar229._0_4_ = -(uint)(auVar104._0_4_ < auVar225._0_4_);
                  auVar229._4_4_ = -(uint)(iVar9 < auVar225._4_4_);
                  auVar229._8_4_ = -(uint)(auVar104._8_4_ < auVar225._8_4_);
                  auVar229._12_4_ = -(uint)(iVar10 < auVar225._12_4_);
                  iVar9 = -(uint)(auVar225._4_4_ == iVar9);
                  iVar10 = -(uint)(auVar225._12_4_ == iVar10);
                  auVar244._4_4_ = iVar9;
                  auVar244._0_4_ = iVar9;
                  auVar244._8_4_ = iVar10;
                  auVar244._12_4_ = iVar10;
                  auVar200._4_4_ = auVar229._4_4_;
                  auVar200._0_4_ = auVar229._4_4_;
                  auVar200._8_4_ = auVar229._12_4_;
                  auVar200._12_4_ = auVar229._12_4_;
                  auVar201._8_4_ = 0xffffffff;
                  auVar201._0_8_ = 0xffffffffffffffff;
                  auVar201._12_4_ = 0xffffffff;
                  auVar201 = (auVar200 | auVar244 & auVar229) ^ auVar201;
                  if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0xff7fffff;
                  }
                  pMVar14 = (Mat *)(ulong)auVar201._8_2_;
                  if ((auVar201 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0xff7fffff;
                  }
                  uVar23 = uVar23 + 4;
                } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
              }
              pMVar26 = pMVar14;
              if (iVar11 < 1) goto LAB_001386f0;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)top_blob->data;
              pMVar14 = (Mat *)0x0;
              in_R9D = 0;
              do {
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                    fVar36 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                    if (fVar1 <= fVar36) {
                      fVar1 = fVar36;
                    }
                    *(float *)((long)&pMVar26->data + uVar23 * 4) = fVar1;
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                bVar29 = false;
              } while (pMVar14 != pMVar19);
            }
            else {
              bVar29 = true;
              if (reduce_c == false && (bVar24 & 1) == 0) {
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create(top_blob,uVar13,1,iVar11,sVar2,opt->blob_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                sVar2 = top_blob->cstep;
                uVar25 = top_blob->c * (int)sVar2;
                if (0 < (int)uVar25) {
                  pvVar34 = top_blob->data;
                  lVar33 = (ulong)uVar25 - 1;
                  auVar63._8_4_ = (int)lVar33;
                  auVar63._0_8_ = lVar33;
                  auVar63._12_4_ = (int)((ulong)lVar33 >> 0x20);
                  pMVar26 = (Mat *)0x0;
                  auVar63 = auVar63 ^ _DAT_0016ebc0;
                  do {
                    auVar163._8_4_ = (int)pMVar26;
                    auVar163._0_8_ = pMVar26;
                    auVar163._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                    auVar225 = (auVar163 | auVar52) ^ auVar134;
                    iVar9 = auVar63._4_4_;
                    if ((bool)(~(auVar225._4_4_ == iVar9 && auVar63._0_4_ < auVar225._0_4_ ||
                                iVar9 < auVar225._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4) = 0xff7fffff;
                    }
                    if ((auVar225._12_4_ != auVar63._12_4_ || auVar225._8_4_ <= auVar63._8_4_) &&
                        auVar225._12_4_ <= auVar63._12_4_) {
                      *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 4) = 0xff7fffff;
                    }
                    auVar225 = (auVar163 | auVar60) ^ auVar134;
                    iVar10 = auVar225._4_4_;
                    if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar63._0_4_)) {
                      *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 8) = 0xff7fffff;
                      *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 0xc) = 0xff7fffff;
                    }
                    pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                  } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                }
                if (iVar11 < 1) goto LAB_001386f0;
                pvVar34 = bottom_blob->data;
                pvVar31 = top_blob->data;
                pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                sVar3 = top_blob->elemsize;
                pMVar15 = (Mat *)0x0;
                in_R9D = 0;
                do {
                  if (0 < (int)uVar12) {
                    uVar25 = 0;
                    pvVar30 = pvVar34;
                    do {
                      if (0 < (int)uVar13) {
                        pMVar27 = (Mat *)0x0;
                        do {
                          fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                          fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                          if (fVar1 <= fVar36) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                          pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                        } while (pMVar14 != pMVar27);
                      }
                      uVar25 = uVar25 + 1;
                      pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar13 * 4);
                    } while (uVar25 != uVar12);
                  }
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                  pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                  bVar29 = false;
                } while (pMVar15 != pMVar19);
              }
            }
            goto LAB_0013e456;
          }
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar12,iVar11,sVar2,opt->blob_allocator);
          if (0 < iVar11) {
            pvVar34 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar31 = top_blob->data;
            pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
            sVar3 = bottom_blob->cstep;
            pMVar15 = (Mat *)0x0;
            do {
              if (0 < (int)uVar12) {
                uVar32 = 0;
                pvVar30 = pvVar34;
                do {
                  auVar122 = ZEXT816(0xff7fffff);
                  if (0 < (int)uVar13) {
                    pMVar27 = (Mat *)0x0;
                    auVar122 = ZEXT816(0xff7fffff);
                    do {
                      fVar36 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                      if (auVar122._0_4_ <= fVar36) {
                        auVar122._0_4_ = fVar36;
                      }
                      pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                    } while (pMVar14 != pMVar27);
                  }
                  *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                       auVar122._0_4_;
                  uVar32 = uVar32 + 1;
                  pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                } while (uVar32 != uVar23);
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
            } while (pMVar15 != pMVar19);
          }
        }
LAB_001386f0:
        bVar29 = false;
        in_R9D = 0;
      }
LAB_0013e456:
      if (bVar29) goto LAB_0013e45b;
    }
LAB_0013e45e:
    if (in_R9D != 0) {
      return -100;
    }
    goto joined_r0x0013e525;
  case 5:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        uVar12 = bottom_blob->h;
        pMVar19 = (Mat *)(long)(int)uVar12;
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar49._0_8_ = SUB168(auVar48 ^ auVar134,0) << 0x3f;
        auVar49._8_8_ = SUB168(auVar48 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar49);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar12 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar15 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar15 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar27;
            }
            pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar12 != 0) && (pMVar15 != (Mat *)0x0)) {
            if ((int)uVar12 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
              pMVar27 = (Mat *)0x0;
              do {
                auVar120 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar13) {
                  pMVar28 = (Mat *)0x0;
                  auVar120 = ZEXT816(0x7f7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                    if (fVar36 <= auVar120._0_4_) {
                      auVar120._0_4_ = fVar36;
                    }
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar14 != pMVar28);
                }
                *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar120._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
              } while (pMVar27 != pMVar19);
              fVar36 = 3.4028235e+38;
              pMVar14 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              } while (pMVar19 != pMVar14);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                bVar29 = false;
                pMVar26 = pMVar15;
                goto LAB_0013ab12;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
              }
            }
          }
          bVar29 = false;
        }
        else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar26 = (Mat *)(ulong)uVar12;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          if ((int)uVar12 < 1) {
            bVar29 = false;
            in_R9D = 0;
          }
          else {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              auVar114 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                auVar114 = ZEXT816(0x7f7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  if (fVar36 <= auVar114._0_4_) {
                    auVar114._0_4_ = fVar36;
                  }
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar114._0_4_;
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
LAB_00137ccd:
            bVar29 = false;
            in_R9D = 0;
          }
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
          auVar225 = _DAT_0016ed80;
          auVar52 = _DAT_0016ed70;
          auVar60 = _DAT_0016ebc0;
          uVar25 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar25) {
            pvVar34 = top_blob->data;
            lVar33 = (ulong)uVar25 - 1;
            auVar58._8_4_ = (int)lVar33;
            auVar58._0_8_ = lVar33;
            auVar58._12_4_ = (int)((ulong)lVar33 >> 0x20);
            uVar23 = 0;
            auVar58 = auVar58 ^ _DAT_0016ebc0;
            do {
              auVar157._8_4_ = (int)uVar23;
              auVar157._0_8_ = uVar23;
              auVar157._12_4_ = (int)(uVar23 >> 0x20);
              auVar220 = (auVar157 | auVar225) ^ auVar60;
              iVar9 = auVar58._4_4_;
              iVar10 = auVar58._12_4_;
              if ((bool)(~(auVar220._4_4_ == iVar9 && auVar58._0_4_ < auVar220._0_4_ ||
                          iVar9 < auVar220._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x7f7fffff;
              }
              if ((auVar220._12_4_ != iVar10 || auVar220._8_4_ <= auVar58._8_4_) &&
                  auVar220._12_4_ <= iVar10) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x7f7fffff;
              }
              auVar220 = (auVar157 | auVar52) ^ auVar60;
              auVar223._0_4_ = -(uint)(auVar58._0_4_ < auVar220._0_4_);
              auVar223._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
              auVar223._8_4_ = -(uint)(auVar58._8_4_ < auVar220._8_4_);
              auVar223._12_4_ = -(uint)(iVar10 < auVar220._12_4_);
              iVar9 = -(uint)(auVar220._4_4_ == iVar9);
              iVar10 = -(uint)(auVar220._12_4_ == iVar10);
              auVar239._4_4_ = iVar9;
              auVar239._0_4_ = iVar9;
              auVar239._8_4_ = iVar10;
              auVar239._12_4_ = iVar10;
              auVar158._4_4_ = auVar223._4_4_;
              auVar158._0_4_ = auVar223._4_4_;
              auVar158._8_4_ = auVar223._12_4_;
              auVar158._12_4_ = auVar223._12_4_;
              auVar159._8_4_ = 0xffffffff;
              auVar159._0_8_ = 0xffffffffffffffff;
              auVar159._12_4_ = 0xffffffff;
              auVar159 = (auVar158 | auVar239 & auVar223) ^ auVar159;
              if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x7f7fffff;
              }
              pMVar26 = (Mat *)(ulong)auVar159._8_2_;
              if ((auVar159 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar23 = uVar23 + 4;
            } while ((uVar25 + 3 & 0xfffffffc) != uVar23);
          }
          if (0 < (int)uVar12) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  fVar36 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                  if (fVar36 <= fVar1) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar31 + (long)pMVar15 * 4) = fVar1;
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
            goto LAB_00137ccd;
          }
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          bVar29 = true;
        }
LAB_0013ab12:
        if (!bVar29) break;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) goto LAB_0013637a;
        fVar36 = 3.4028235e+38;
        lVar33 = 0;
        do {
          fVar1 = *(float *)((long)bottom_blob->data + lVar33 * 4);
          if (fVar1 <= fVar36) {
            fVar36 = fVar1;
          }
          lVar33 = lVar33 + 1;
        } while (iVar11 != lVar33);
        goto LAB_00136382;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        lVar33 = (long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        uVar25 = bottom_blob->c;
        pMVar19 = (Mat *)(long)(int)uVar25;
        uVar21 = uVar12 * uVar13;
        auVar80._8_4_ = 0xffffffff;
        auVar80._0_8_ = 0xffffffffffffffff;
        auVar80._12_4_ = 0xffffffff;
        auVar81._0_8_ = SUB168(auVar80 ^ auVar134,0) << 0x3f;
        auVar81._8_8_ = SUB168(auVar80 ^ auVar134,8) << 0x3f;
        iVar11 = movmskpd(uVar21,auVar81);
        bVar16 = reduce_c ^ 1;
        if (iVar11 == 0 && bVar16 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar25 == 0) {
            pMVar14 = (Mat *)0x0;
            pbVar18 = (bool *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar15 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar11 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
              pMVar14 = (Mat *)ptr;
              if (iVar11 != 0) {
                ptr = (void *)0x0;
                pMVar14 = (Mat *)ptr;
              }
            }
            else {
              pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar15;
            }
            pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
            *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar25 != 0) && (pMVar14 != (Mat *)0x0)) {
            if ((int)uVar25 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar26 = (Mat *)bottom_blob->data;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar21) {
                  uVar23 = 0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar21 != uVar23);
                }
                *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
              fVar36 = 3.4028235e+38;
              pMVar15 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar19 != pMVar15);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 == (Allocator *)0x0) {
                if (pMVar14 != (Mat *)0x0) {
                  free(pMVar14);
                }
              }
              else {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                pMVar26 = pMVar14;
              }
            }
          }
LAB_0013e4a6:
          bVar29 = false;
        }
        else {
          if (iVar11 == 0 && reduce_c == false) {
            pMVar26 = (Mat *)(ulong)uVar25;
            Mat::create(top_blob,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(ulong)uVar21;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar21) {
                  pMVar15 = (Mat *)0x0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar26 != pMVar15);
                }
                *(float *)((long)pvVar31 + (long)pMVar14 * 4) = fVar36;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar14 != pMVar19);
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar13;
            bVar24 = (byte)iVar11 >> 1 | bVar20;
            if (reduce_c != false || (bVar24 & 1) != 0) {
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)0x1;
                Mat::create((Mat *)&ptr,1,uVar12,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar88._8_4_ = (int)lVar22;
                      auVar88._0_8_ = lVar22;
                      auVar88._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar88 = auVar88 ^ _DAT_0016ebc0;
                      do {
                        auVar183._8_4_ = (int)pMVar26;
                        auVar183._0_8_ = pMVar26;
                        auVar183._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar183 | auVar52) ^ auVar134;
                        iVar11 = auVar88._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar88._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar88._12_4_ || auVar225._8_4_ <= auVar88._8_4_)
                            && auVar225._12_4_ <= auVar88._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar183 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar88._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x7f7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x7f7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          pvVar31 = pvVar34;
                          do {
                            auVar132 = ZEXT816(0x7f7fffff);
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              auVar132 = ZEXT816(0x7f7fffff);
                              do {
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar36 <= auVar132._0_4_) {
                                  auVar132._0_4_ = fVar36;
                                }
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            *(int *)((long)ptr +
                                    uVar32 * 4 +
                                    CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15)
                                 = auVar132._0_4_;
                            uVar32 = uVar32 + 1;
                            pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                          } while (uVar32 != uVar23);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar89._8_4_ = (int)lVar33;
                      auVar89._0_8_ = lVar33;
                      auVar89._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar32 = 0;
                      auVar89 = auVar89 ^ _DAT_0016ebc0;
                      do {
                        auVar184._8_4_ = (int)uVar32;
                        auVar184._0_8_ = uVar32;
                        auVar184._12_4_ = (int)(uVar32 >> 0x20);
                        auVar225 = (auVar184 | auVar52) ^ auVar134;
                        iVar11 = auVar89._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar89._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar89._12_4_ || auVar225._8_4_ <= auVar89._8_4_)
                            && auVar225._12_4_ <= auVar89._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar184 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar89._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0x7f7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0x7f7fffff;
                        }
                        uVar32 = uVar32 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + uVar32 * 4);
                            fVar36 = *(float *)((long)pvVar34 + uVar32 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + uVar32 * 4) = fVar1;
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                goto LAB_0013e4a6;
              }
              pMVar26 = (Mat *)(ulong)uVar7;
              bVar24 = (byte)iVar11 | bVar8;
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create((Mat *)&ptr,uVar13,1,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar100._8_4_ = (int)lVar22;
                      auVar100._0_8_ = lVar22;
                      auVar100._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar100 = auVar100 ^ _DAT_0016ebc0;
                      do {
                        auVar195._8_4_ = (int)pMVar26;
                        auVar195._0_8_ = pMVar26;
                        auVar195._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar195 | auVar52) ^ auVar134;
                        iVar11 = auVar100._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar100._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar100._12_4_ || auVar225._8_4_ <= auVar100._8_4_)
                            && auVar225._12_4_ <= auVar100._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar195 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar100._0_4_)
                           ) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x7f7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x7f7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar21 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar36 <= fVar1) {
                                  fVar1 = fVar36;
                                }
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar21 = uVar21 + 1;
                            pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                          } while (uVar21 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 +
                                          CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar12 - 1;
                      auVar101._8_4_ = (int)lVar33;
                      auVar101._0_8_ = lVar33;
                      auVar101._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar101 = auVar101 ^ _DAT_0016ebc0;
                      do {
                        auVar196._8_4_ = (int)uVar23;
                        auVar196._0_8_ = uVar23;
                        auVar196._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar196 | auVar52) ^ auVar134;
                        iVar11 = auVar101._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar101._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar101._12_4_ || auVar225._8_4_ <= auVar101._8_4_)
                            && auVar225._12_4_ <= auVar101._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar196 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar101._0_4_)
                           ) {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0x7f7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0x7f7fffff;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                            fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + (long)pMVar15 * 4) = fVar1;
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                bVar29 = false;
              }
              else if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,uVar12,sVar2,opt->blob_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                uVar13 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar13) {
                  pvVar34 = top_blob->data;
                  lVar33 = (ulong)uVar13 - 1;
                  auVar108._8_4_ = (int)lVar33;
                  auVar108._0_8_ = lVar33;
                  auVar108._12_4_ = (int)((ulong)lVar33 >> 0x20);
                  uVar23 = 0;
                  auVar108 = auVar108 ^ _DAT_0016ebc0;
                  do {
                    auVar211._8_4_ = (int)uVar23;
                    auVar211._0_8_ = uVar23;
                    auVar211._12_4_ = (int)(uVar23 >> 0x20);
                    auVar225 = (auVar211 | auVar52) ^ auVar134;
                    iVar11 = auVar108._4_4_;
                    iVar9 = auVar108._12_4_;
                    if ((bool)(~(auVar225._4_4_ == iVar11 && auVar108._0_4_ < auVar225._0_4_ ||
                                iVar11 < auVar225._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x7f7fffff;
                    }
                    if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar108._8_4_) &&
                        auVar225._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x7f7fffff;
                    }
                    auVar225 = (auVar211 | auVar60) ^ auVar134;
                    auVar233._0_4_ = -(uint)(auVar108._0_4_ < auVar225._0_4_);
                    auVar233._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                    auVar233._8_4_ = -(uint)(auVar108._8_4_ < auVar225._8_4_);
                    auVar233._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                    iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                    iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                    auVar248._4_4_ = iVar11;
                    auVar248._0_4_ = iVar11;
                    auVar248._8_4_ = iVar9;
                    auVar248._12_4_ = iVar9;
                    auVar212._4_4_ = auVar233._4_4_;
                    auVar212._0_4_ = auVar233._4_4_;
                    auVar212._8_4_ = auVar233._12_4_;
                    auVar212._12_4_ = auVar233._12_4_;
                    auVar213._8_4_ = 0xffffffff;
                    auVar213._0_8_ = 0xffffffffffffffff;
                    auVar213._12_4_ = 0xffffffff;
                    auVar213 = (auVar212 | auVar248 & auVar233) ^ auVar213;
                    if ((auVar213 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x7f7fffff;
                    }
                    pMVar14 = (Mat *)(ulong)auVar213._8_2_;
                    if ((auVar213 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x7f7fffff;
                    }
                    uVar23 = uVar23 + 4;
                  } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
                }
                pMVar26 = pMVar14;
                if ((int)uVar25 < 1) goto LAB_0013aedf;
                sVar2 = bottom_blob->elemsize;
                sVar3 = bottom_blob->cstep;
                pvVar34 = bottom_blob->data;
                pMVar26 = (Mat *)top_blob->data;
                pMVar14 = (Mat *)0x0;
                in_R9D = 0;
                do {
                  if (0 < (int)uVar21) {
                    uVar23 = 0;
                    do {
                      fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                      fVar36 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                      if (fVar36 <= fVar1) {
                        fVar1 = fVar36;
                      }
                      *(float *)((long)&pMVar26->data + uVar23 * 4) = fVar1;
                      uVar23 = uVar23 + 1;
                    } while (uVar21 != uVar23);
                  }
                  pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                  bVar29 = false;
                } while (pMVar14 != pMVar19);
              }
              else {
                bVar29 = true;
                if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar26 = (Mat *)(ulong)uVar13;
                  Mat::create(top_blob,uVar13,uVar25,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_0016ed80;
                  auVar60 = _DAT_0016ed70;
                  auVar134 = _DAT_0016ebc0;
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar21) {
                    pvVar34 = top_blob->data;
                    lVar33 = (ulong)uVar21 - 1;
                    auVar82._8_4_ = (int)lVar33;
                    auVar82._0_8_ = lVar33;
                    auVar82._12_4_ = (int)((ulong)lVar33 >> 0x20);
                    uVar23 = 0;
                    auVar82 = auVar82 ^ _DAT_0016ebc0;
                    do {
                      auVar175._8_4_ = (int)uVar23;
                      auVar175._0_8_ = uVar23;
                      auVar175._12_4_ = (int)(uVar23 >> 0x20);
                      auVar225 = (auVar175 | auVar52) ^ auVar134;
                      iVar11 = auVar82._4_4_;
                      iVar9 = auVar82._12_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar11 && auVar82._0_4_ < auVar225._0_4_ ||
                                  iVar11 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x7f7fffff;
                      }
                      if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar82._8_4_) &&
                          auVar225._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x7f7fffff;
                      }
                      auVar225 = (auVar175 | auVar60) ^ auVar134;
                      auVar227._0_4_ = -(uint)(auVar82._0_4_ < auVar225._0_4_);
                      auVar227._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                      auVar227._8_4_ = -(uint)(auVar82._8_4_ < auVar225._8_4_);
                      auVar227._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                      iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                      iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                      auVar242._4_4_ = iVar11;
                      auVar242._0_4_ = iVar11;
                      auVar242._8_4_ = iVar9;
                      auVar242._12_4_ = iVar9;
                      auVar176._4_4_ = auVar227._4_4_;
                      auVar176._0_4_ = auVar227._4_4_;
                      auVar176._8_4_ = auVar227._12_4_;
                      auVar176._12_4_ = auVar227._12_4_;
                      auVar177._8_4_ = 0xffffffff;
                      auVar177._0_8_ = 0xffffffffffffffff;
                      auVar177._12_4_ = 0xffffffff;
                      auVar177 = (auVar176 | auVar242 & auVar227) ^ auVar177;
                      if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x7f7fffff;
                      }
                      pMVar26 = (Mat *)(ulong)auVar177._8_2_;
                      if ((auVar177 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x7f7fffff;
                      }
                      uVar23 = uVar23 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar23);
                  }
                  if ((int)uVar25 < 1) goto LAB_0013aedf;
                  pvVar34 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar26 = (Mat *)top_blob->data;
                  iVar11 = top_blob->w;
                  sVar3 = top_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  in_R9D = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar25 = 0;
                      pvVar31 = pvVar34;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                            fVar36 = *(float *)((long)&pMVar26->data + (long)pMVar27 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)&pMVar26->data + (long)pMVar27 * 4) = fVar1;
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar14 != pMVar27);
                        }
                        uVar25 = uVar25 + 1;
                        pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar13 * 4);
                      } while (uVar25 != uVar12);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar4);
                    pMVar26 = (Mat *)((long)&pMVar26->data + (long)iVar11 * sVar3);
                    bVar29 = false;
                  } while (pMVar15 != pMVar19);
                }
              }
              goto LAB_0013e4aa;
            }
            pMVar26 = (Mat *)(ulong)uVar12;
            Mat::create(top_blob,uVar12,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar12) {
                  uVar32 = 0;
                  pvVar30 = pvVar34;
                  do {
                    auVar129 = ZEXT816(0x7f7fffff);
                    if (0 < (int)uVar13) {
                      pMVar27 = (Mat *)0x0;
                      auVar129 = ZEXT816(0x7f7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                        if (fVar36 <= auVar129._0_4_) {
                          auVar129._0_4_ = fVar36;
                        }
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                         auVar129._0_4_;
                    uVar32 = uVar32 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                  } while (uVar32 != uVar23);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
            }
          }
LAB_0013aedf:
          bVar29 = false;
          in_R9D = 0;
        }
LAB_0013e4aa:
        if (!bVar29) break;
      }
    }
    else {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        iVar10 = bottom_blob->h;
        pMVar19 = (Mat *)(long)iVar10;
        auVar41._8_4_ = 0xffffffff;
        auVar41._0_8_ = 0xffffffffffffffff;
        auVar41._12_4_ = 0xffffffff;
        auVar42._0_8_ = SUB168(auVar41 ^ auVar134,0) << 0x3f;
        auVar42._8_8_ = SUB168(auVar41 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar42);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (iVar10 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar15 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar15 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar27;
            }
            pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar10 != 0) && (pMVar15 != (Mat *)0x0)) {
            if (iVar10 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
              pMVar27 = (Mat *)0x0;
              do {
                auVar117 = ZEXT816(0x7f7fffff);
                if (0 < (int)uVar13) {
                  pMVar28 = (Mat *)0x0;
                  auVar117 = ZEXT816(0x7f7fffff);
                  do {
                    fVar36 = *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                    if (fVar36 <= auVar117._0_4_) {
                      auVar117._0_4_ = fVar36;
                    }
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar14 != pMVar28);
                }
                *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar117._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
              } while (pMVar27 != pMVar19);
              fVar36 = 3.4028235e+38;
              pMVar14 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              } while (pMVar19 != pMVar14);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                bVar29 = false;
                pMVar26 = pMVar15;
                goto LAB_00138817;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
              }
            }
          }
          bVar29 = false;
        }
        else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,iVar10,sVar2,opt->blob_allocator);
          if (iVar10 < 1) {
            bVar29 = false;
            in_R9D = 0;
          }
          else {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              auVar111 = ZEXT816(0x7f7fffff);
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                auVar111 = ZEXT816(0x7f7fffff);
                do {
                  fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  if (fVar36 <= auVar111._0_4_) {
                    auVar111._0_4_ = fVar36;
                  }
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar111._0_4_;
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
LAB_0013716a:
            bVar29 = false;
            in_R9D = 0;
          }
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,1,sVar2,opt->blob_allocator);
          auVar225 = _DAT_0016ed80;
          auVar52 = _DAT_0016ed70;
          auVar60 = _DAT_0016ebc0;
          uVar12 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar12) {
            pvVar34 = top_blob->data;
            lVar33 = (ulong)uVar12 - 1;
            auVar54._8_4_ = (int)lVar33;
            auVar54._0_8_ = lVar33;
            auVar54._12_4_ = (int)((ulong)lVar33 >> 0x20);
            uVar23 = 0;
            auVar54 = auVar54 ^ _DAT_0016ebc0;
            do {
              auVar148._8_4_ = (int)uVar23;
              auVar148._0_8_ = uVar23;
              auVar148._12_4_ = (int)(uVar23 >> 0x20);
              auVar220 = (auVar148 | auVar225) ^ auVar60;
              iVar9 = auVar54._4_4_;
              iVar217 = auVar54._12_4_;
              if ((bool)(~(auVar220._4_4_ == iVar9 && auVar54._0_4_ < auVar220._0_4_ ||
                          iVar9 < auVar220._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x7f7fffff;
              }
              if ((auVar220._12_4_ != iVar217 || auVar220._8_4_ <= auVar54._8_4_) &&
                  auVar220._12_4_ <= iVar217) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x7f7fffff;
              }
              auVar220 = (auVar148 | auVar52) ^ auVar60;
              auVar219._0_4_ = -(uint)(auVar54._0_4_ < auVar220._0_4_);
              auVar219._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
              auVar219._8_4_ = -(uint)(auVar54._8_4_ < auVar220._8_4_);
              auVar219._12_4_ = -(uint)(iVar217 < auVar220._12_4_);
              iVar9 = -(uint)(auVar220._4_4_ == iVar9);
              iVar217 = -(uint)(auVar220._12_4_ == iVar217);
              auVar236._4_4_ = iVar9;
              auVar236._0_4_ = iVar9;
              auVar236._8_4_ = iVar217;
              auVar236._12_4_ = iVar217;
              auVar149._4_4_ = auVar219._4_4_;
              auVar149._0_4_ = auVar219._4_4_;
              auVar149._8_4_ = auVar219._12_4_;
              auVar149._12_4_ = auVar219._12_4_;
              auVar150._8_4_ = 0xffffffff;
              auVar150._0_8_ = 0xffffffffffffffff;
              auVar150._12_4_ = 0xffffffff;
              auVar150 = (auVar149 | auVar236 & auVar219) ^ auVar150;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x7f7fffff;
              }
              pMVar26 = (Mat *)(ulong)auVar150._8_2_;
              if ((auVar150 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x7f7fffff;
              }
              uVar23 = uVar23 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
          }
          if (0 < iVar10) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                do {
                  fVar1 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  fVar36 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                  if (fVar36 <= fVar1) {
                    fVar1 = fVar36;
                  }
                  *(float *)((long)pvVar31 + (long)pMVar15 * 4) = fVar1;
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
            goto LAB_0013716a;
          }
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          bVar29 = true;
        }
LAB_00138817:
        if (!bVar29) break;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) {
LAB_0013637a:
          fVar36 = 3.4028235e+38;
        }
        else {
          fVar36 = 3.4028235e+38;
          lVar33 = 0;
          do {
            fVar1 = *(float *)((long)bottom_blob->data + lVar33 * 4);
            if (fVar1 <= fVar36) {
              fVar36 = fVar1;
            }
            lVar33 = lVar33 + 1;
          } while (iVar11 != lVar33);
        }
LAB_00136382:
        *(float *)top_blob->data = fVar36;
        goto LAB_0013e4af;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        lVar33 = (long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        iVar11 = bottom_blob->c;
        pMVar19 = (Mat *)(long)iVar11;
        uVar25 = uVar12 * uVar13;
        auVar64._8_4_ = 0xffffffff;
        auVar64._0_8_ = 0xffffffffffffffff;
        auVar64._12_4_ = 0xffffffff;
        auVar65._0_8_ = SUB168(auVar64 ^ auVar134,0) << 0x3f;
        auVar65._8_8_ = SUB168(auVar64 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(uVar25,auVar65);
        bVar16 = reduce_c ^ 1;
        if (iVar9 == 0 && bVar16 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (iVar11 == 0) {
            pMVar14 = (Mat *)0x0;
            pbVar18 = (bool *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar15 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
              pMVar14 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar14 = (Mat *)ptr;
              }
            }
            else {
              pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar15;
            }
            pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
            *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar11 != 0) && (pMVar14 != (Mat *)0x0)) {
            if (iVar11 < 1) {
              fVar36 = 3.4028235e+38;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar26 = (Mat *)bottom_blob->data;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
              fVar36 = 3.4028235e+38;
              pMVar15 = (Mat *)0x0;
              do {
                fVar1 = *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
                if (fVar1 <= fVar36) {
                  fVar36 = fVar1;
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar19 != pMVar15);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 == (Allocator *)0x0) {
                if (pMVar14 != (Mat *)0x0) {
                  free(pMVar14);
                }
              }
              else {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                pMVar26 = pMVar14;
              }
            }
          }
LAB_0013d303:
          bVar29 = false;
        }
        else {
          if (iVar9 == 0 && reduce_c == false) {
            pMVar26 = (Mat *)0x1;
            Mat::create(top_blob,1,1,iVar11,sVar2,opt->blob_allocator);
            if (0 < iVar11) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = 3.4028235e+38;
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  fVar36 = 3.4028235e+38;
                  do {
                    fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                    if (fVar1 <= fVar36) {
                      fVar36 = fVar1;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)pvVar31 + (long)pMVar26 * (long)pMVar14) = fVar36;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar14 != pMVar19);
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar13;
            bVar24 = (byte)iVar9 >> 1 | bVar20;
            if (reduce_c != false || (bVar24 & 1) != 0) {
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,1,uVar12,1,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)0x1;
                Mat::create((Mat *)&ptr,1,uVar12,iVar11,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar25 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar25) {
                      lVar22 = (ulong)uVar25 - 1;
                      auVar73._8_4_ = (int)lVar22;
                      auVar73._0_8_ = lVar22;
                      auVar73._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar73 = auVar73 ^ _DAT_0016ebc0;
                      do {
                        auVar168._8_4_ = (int)pMVar26;
                        auVar168._0_8_ = pMVar26;
                        auVar168._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar168 | auVar52) ^ auVar134;
                        iVar9 = auVar73._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar73._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar73._12_4_ || auVar225._8_4_ <= auVar73._8_4_)
                            && auVar225._12_4_ <= auVar73._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar168 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar73._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x7f7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x7f7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < iVar11) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          pvVar31 = pvVar34;
                          do {
                            auVar126 = ZEXT816(0x7f7fffff);
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              auVar126 = ZEXT816(0x7f7fffff);
                              do {
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar36 <= auVar126._0_4_) {
                                  auVar126._0_4_ = fVar36;
                                }
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            *(int *)((long)ptr +
                                    uVar32 * 4 +
                                    CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15)
                                 = auVar126._0_4_;
                            uVar32 = uVar32 + 1;
                            pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                          } while (uVar32 != uVar23);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar74._8_4_ = (int)lVar33;
                      auVar74._0_8_ = lVar33;
                      auVar74._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar32 = 0;
                      auVar74 = auVar74 ^ _DAT_0016ebc0;
                      do {
                        auVar169._8_4_ = (int)uVar32;
                        auVar169._0_8_ = uVar32;
                        auVar169._12_4_ = (int)(uVar32 >> 0x20);
                        auVar225 = (auVar169 | auVar52) ^ auVar134;
                        iVar9 = auVar74._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar74._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar74._12_4_ || auVar225._8_4_ <= auVar74._8_4_)
                            && auVar225._12_4_ <= auVar74._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar169 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar74._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0x7f7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0x7f7fffff;
                        }
                        uVar32 = uVar32 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                    }
                    if (0 < iVar11) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + uVar32 * 4);
                            fVar36 = *(float *)((long)pvVar34 + uVar32 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + uVar32 * 4) = fVar1;
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
              }
              else {
                pMVar26 = (Mat *)(ulong)uVar7;
                bVar24 = (byte)iVar9 | bVar8;
                if ((bVar24 & 1) != 0 || bVar16 != 0) {
                  if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                    Mat::create(top_blob,uVar13,uVar12,1,sVar2,opt->blob_allocator);
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pvVar34 = top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar105._8_4_ = (int)lVar33;
                      auVar105._0_8_ = lVar33;
                      auVar105._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar105 = auVar105 ^ _DAT_0016ebc0;
                      do {
                        auVar202._8_4_ = (int)uVar23;
                        auVar202._0_8_ = uVar23;
                        auVar202._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar202 | auVar52) ^ auVar134;
                        iVar9 = auVar105._4_4_;
                        iVar10 = auVar105._12_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar105._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != iVar10 || auVar225._8_4_ <= auVar105._8_4_) &&
                            auVar225._12_4_ <= iVar10) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar202 | auVar60) ^ auVar134;
                        auVar230._0_4_ = -(uint)(auVar105._0_4_ < auVar225._0_4_);
                        auVar230._4_4_ = -(uint)(iVar9 < auVar225._4_4_);
                        auVar230._8_4_ = -(uint)(auVar105._8_4_ < auVar225._8_4_);
                        auVar230._12_4_ = -(uint)(iVar10 < auVar225._12_4_);
                        iVar9 = -(uint)(auVar225._4_4_ == iVar9);
                        iVar10 = -(uint)(auVar225._12_4_ == iVar10);
                        auVar245._4_4_ = iVar9;
                        auVar245._0_4_ = iVar9;
                        auVar245._8_4_ = iVar10;
                        auVar245._12_4_ = iVar10;
                        auVar203._4_4_ = auVar230._4_4_;
                        auVar203._0_4_ = auVar230._4_4_;
                        auVar203._8_4_ = auVar230._12_4_;
                        auVar203._12_4_ = auVar230._12_4_;
                        auVar204._8_4_ = 0xffffffff;
                        auVar204._0_8_ = 0xffffffffffffffff;
                        auVar204._12_4_ = 0xffffffff;
                        auVar204 = (auVar203 | auVar245 & auVar230) ^ auVar204;
                        if ((auVar204 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x7f7fffff;
                        }
                        pMVar14 = (Mat *)(ulong)auVar204._8_2_;
                        if ((auVar204 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x7f7fffff;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
                    }
                    pMVar26 = pMVar14;
                    if (iVar11 < 1) goto LAB_00138c10;
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar34 = bottom_blob->data;
                    pMVar26 = (Mat *)top_blob->data;
                    pMVar14 = (Mat *)0x0;
                    in_R9D = 0;
                    do {
                      if (0 < (int)uVar25) {
                        uVar23 = 0;
                        do {
                          fVar1 = *(float *)((long)pvVar34 + uVar23 * 4);
                          fVar36 = *(float *)((long)&pMVar26->data + uVar23 * 4);
                          if (fVar36 <= fVar1) {
                            fVar1 = fVar36;
                          }
                          *(float *)((long)&pMVar26->data + uVar23 * 4) = fVar1;
                          uVar23 = uVar23 + 1;
                        } while (uVar25 != uVar23);
                      }
                      pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                      pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                      bVar29 = false;
                    } while (pMVar14 != pMVar19);
                  }
                  else {
                    bVar29 = true;
                    if (reduce_c == false && (bVar24 & 1) == 0) {
                      pMVar26 = (Mat *)(ulong)uVar13;
                      Mat::create(top_blob,uVar13,1,iVar11,sVar2,opt->blob_allocator);
                      auVar52 = _DAT_0016ed80;
                      auVar60 = _DAT_0016ed70;
                      auVar134 = _DAT_0016ebc0;
                      sVar2 = top_blob->cstep;
                      uVar25 = top_blob->c * (int)sVar2;
                      if (0 < (int)uVar25) {
                        pvVar34 = top_blob->data;
                        lVar33 = (ulong)uVar25 - 1;
                        auVar66._8_4_ = (int)lVar33;
                        auVar66._0_8_ = lVar33;
                        auVar66._12_4_ = (int)((ulong)lVar33 >> 0x20);
                        pMVar26 = (Mat *)0x0;
                        auVar66 = auVar66 ^ _DAT_0016ebc0;
                        do {
                          auVar164._8_4_ = (int)pMVar26;
                          auVar164._0_8_ = pMVar26;
                          auVar164._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                          auVar225 = (auVar164 | auVar52) ^ auVar134;
                          iVar9 = auVar66._4_4_;
                          if ((bool)(~(auVar225._4_4_ == iVar9 && auVar66._0_4_ < auVar225._0_4_ ||
                                      iVar9 < auVar225._4_4_) & 1)) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4) = 0x7f7fffff;
                          }
                          if ((auVar225._12_4_ != auVar66._12_4_ || auVar225._8_4_ <= auVar66._8_4_)
                              && auVar225._12_4_ <= auVar66._12_4_) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 4) = 0x7f7fffff;
                          }
                          auVar225 = (auVar164 | auVar60) ^ auVar134;
                          iVar10 = auVar225._4_4_;
                          if (iVar10 <= iVar9 &&
                              (iVar10 != iVar9 || auVar225._0_4_ <= auVar66._0_4_)) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 8) = 0x7f7fffff;
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 0xc) = 0x7f7fffff;
                          }
                          pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                        } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                      }
                      if (iVar11 < 1) goto LAB_00138c10;
                      pvVar34 = bottom_blob->data;
                      pvVar31 = top_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      sVar3 = top_blob->elemsize;
                      pMVar15 = (Mat *)0x0;
                      in_R9D = 0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar25 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar36 <= fVar1) {
                                  fVar1 = fVar36;
                                }
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar25 = uVar25 + 1;
                            pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar13 * 4);
                          } while (uVar25 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                        bVar29 = false;
                      } while (pMVar15 != pMVar19);
                    }
                  }
                  goto LAB_0013e4aa;
                }
                Mat::create(top_blob,uVar13,1,1,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create((Mat *)&ptr,uVar13,1,iVar11,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar25 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar25) {
                      lVar22 = (ulong)uVar25 - 1;
                      auVar94._8_4_ = (int)lVar22;
                      auVar94._0_8_ = lVar22;
                      auVar94._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar94 = auVar94 ^ _DAT_0016ebc0;
                      do {
                        auVar189._8_4_ = (int)pMVar26;
                        auVar189._0_8_ = pMVar26;
                        auVar189._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar189 | auVar52) ^ auVar134;
                        iVar9 = auVar94._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar94._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar94._12_4_ || auVar225._8_4_ <= auVar94._8_4_)
                            && auVar225._12_4_ <= auVar94._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar189 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar94._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x7f7fffff;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x7f7fffff;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < iVar11) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar25 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                fVar1 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                                fVar36 = *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                if (fVar36 <= fVar1) {
                                  fVar1 = fVar36;
                                }
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) = fVar1;
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar25 = uVar25 + 1;
                            pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                          } while (uVar25 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 +
                                          CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar12 - 1;
                      auVar95._8_4_ = (int)lVar33;
                      auVar95._0_8_ = lVar33;
                      auVar95._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar95 = auVar95 ^ _DAT_0016ebc0;
                      do {
                        auVar190._8_4_ = (int)uVar23;
                        auVar190._0_8_ = uVar23;
                        auVar190._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar190 | auVar52) ^ auVar134;
                        iVar9 = auVar95._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar95._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0x7f7fffff;
                        }
                        if ((auVar225._12_4_ != auVar95._12_4_ || auVar225._8_4_ <= auVar95._8_4_)
                            && auVar225._12_4_ <= auVar95._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0x7f7fffff;
                        }
                        auVar225 = (auVar190 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar95._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0x7f7fffff;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0x7f7fffff;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                    }
                    if (0 < iVar11) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            fVar1 = *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                            fVar36 = *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                            if (fVar36 <= fVar1) {
                              fVar1 = fVar36;
                            }
                            *(float *)((long)pvVar34 + (long)pMVar15 * 4) = fVar1;
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
              }
              Mat::~Mat((Mat *)&ptr);
              goto LAB_0013d303;
            }
            pMVar26 = (Mat *)0x1;
            Mat::create(top_blob,1,uVar12,iVar11,sVar2,opt->blob_allocator);
            if (0 < iVar11) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar12) {
                  uVar32 = 0;
                  pvVar30 = pvVar34;
                  do {
                    auVar123 = ZEXT816(0x7f7fffff);
                    if (0 < (int)uVar13) {
                      pMVar27 = (Mat *)0x0;
                      auVar123 = ZEXT816(0x7f7fffff);
                      do {
                        fVar36 = *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                        if (fVar36 <= auVar123._0_4_) {
                          auVar123._0_4_ = fVar36;
                        }
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                         auVar123._0_4_;
                    uVar32 = uVar32 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                  } while (uVar32 != uVar23);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
            }
          }
LAB_00138c10:
          bVar29 = false;
          in_R9D = 0;
        }
        goto LAB_0013e4aa;
      }
    }
LAB_0013e4af:
    in_R9D = 0;
    break;
  case 6:
    fVar35 = this->coeff;
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        uVar12 = bottom_blob->h;
        pMVar19 = (Mat *)(long)(int)uVar12;
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar51._0_8_ = SUB168(auVar50 ^ auVar134,0) << 0x3f;
        auVar51._8_8_ = SUB168(auVar50 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar51);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar12 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar15 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar15 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar27;
            }
            pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar12 != 0) && (pMVar15 != (Mat *)0x0)) {
            if ((int)uVar12 < 1) {
              fVar36 = 1.0;
            }
            else {
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
              pMVar27 = (Mat *)0x0;
              do {
                auVar121 = ZEXT816(0x3f800000);
                if (0 < (int)uVar13) {
                  pMVar28 = (Mat *)0x0;
                  auVar121 = ZEXT816(0x3f800000);
                  do {
                    auVar121._0_4_ = auVar121._0_4_ * *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar14 != pMVar28);
                }
                *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar121._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
              } while (pMVar27 != pMVar19);
              fVar36 = 1.0;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              } while (pMVar19 != pMVar14);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                bVar29 = false;
                pMVar26 = pMVar15;
                goto LAB_0013b006;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
              }
            }
          }
          bVar29 = false;
        }
        else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar26 = (Mat *)(ulong)uVar12;
          Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
          if ((int)uVar12 < 1) {
            bVar29 = false;
            in_R9D = 0;
          }
          else {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              auVar115 = ZEXT816(0x3f800000);
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                auVar115 = ZEXT816(0x3f800000);
                do {
                  auVar115._0_4_ = auVar115._0_4_ * *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar115._0_4_;
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
LAB_00137e5a:
            bVar29 = false;
            in_R9D = 0;
          }
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
          auVar225 = _DAT_0016ed80;
          auVar52 = _DAT_0016ed70;
          auVar60 = _DAT_0016ebc0;
          uVar25 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar25) {
            pvVar34 = top_blob->data;
            lVar33 = (ulong)uVar25 - 1;
            auVar59._8_4_ = (int)lVar33;
            auVar59._0_8_ = lVar33;
            auVar59._12_4_ = (int)((ulong)lVar33 >> 0x20);
            uVar23 = 0;
            auVar59 = auVar59 ^ _DAT_0016ebc0;
            do {
              auVar160._8_4_ = (int)uVar23;
              auVar160._0_8_ = uVar23;
              auVar160._12_4_ = (int)(uVar23 >> 0x20);
              auVar220 = (auVar160 | auVar225) ^ auVar60;
              iVar9 = auVar59._4_4_;
              iVar10 = auVar59._12_4_;
              if ((bool)(~(auVar220._4_4_ == iVar9 && auVar59._0_4_ < auVar220._0_4_ ||
                          iVar9 < auVar220._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x3f800000;
              }
              if ((auVar220._12_4_ != iVar10 || auVar220._8_4_ <= auVar59._8_4_) &&
                  auVar220._12_4_ <= iVar10) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x3f800000;
              }
              auVar220 = (auVar160 | auVar52) ^ auVar60;
              auVar224._0_4_ = -(uint)(auVar59._0_4_ < auVar220._0_4_);
              auVar224._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
              auVar224._8_4_ = -(uint)(auVar59._8_4_ < auVar220._8_4_);
              auVar224._12_4_ = -(uint)(iVar10 < auVar220._12_4_);
              iVar9 = -(uint)(auVar220._4_4_ == iVar9);
              iVar10 = -(uint)(auVar220._12_4_ == iVar10);
              auVar240._4_4_ = iVar9;
              auVar240._0_4_ = iVar9;
              auVar240._8_4_ = iVar10;
              auVar240._12_4_ = iVar10;
              auVar161._4_4_ = auVar224._4_4_;
              auVar161._0_4_ = auVar224._4_4_;
              auVar161._8_4_ = auVar224._12_4_;
              auVar161._12_4_ = auVar224._12_4_;
              auVar162._8_4_ = 0xffffffff;
              auVar162._0_8_ = 0xffffffffffffffff;
              auVar162._12_4_ = 0xffffffff;
              auVar162 = (auVar161 | auVar240 & auVar224) ^ auVar162;
              if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x3f800000;
              }
              pMVar26 = (Mat *)(ulong)auVar162._8_2_;
              if ((auVar162 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x3f800000;
              }
              uVar23 = uVar23 + 4;
            } while ((uVar25 + 3 & 0xfffffffc) != uVar23);
          }
          if (0 < (int)uVar12) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar31 + (long)pMVar15 * 4) =
                       *(float *)((long)pvVar34 + (long)pMVar15 * 4) *
                       *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
            goto LAB_00137e5a;
          }
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          bVar29 = true;
        }
LAB_0013b006:
        if (!bVar29) break;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) goto LAB_0013638e;
        fVar36 = 1.0;
        lVar33 = 0;
        do {
          fVar36 = fVar36 * *(float *)((long)bottom_blob->data + lVar33 * 4);
          lVar33 = lVar33 + 1;
        } while (iVar11 != lVar33);
        goto LAB_00136396;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        lVar33 = (long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        uVar25 = bottom_blob->c;
        pMVar19 = (Mat *)(long)(int)uVar25;
        uVar21 = uVar12 * uVar13;
        auVar83._8_4_ = 0xffffffff;
        auVar83._0_8_ = 0xffffffffffffffff;
        auVar83._12_4_ = 0xffffffff;
        auVar84._0_8_ = SUB168(auVar83 ^ auVar134,0) << 0x3f;
        auVar84._8_8_ = SUB168(auVar83 ^ auVar134,8) << 0x3f;
        iVar11 = movmskpd(uVar21,auVar84);
        bVar16 = reduce_c ^ 1;
        if (iVar11 == 0 && bVar16 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (uVar25 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar14 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar15 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar11 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
              pMVar14 = (Mat *)ptr;
              if (iVar11 != 0) {
                ptr = (void *)0x0;
                pMVar14 = (Mat *)ptr;
              }
            }
            else {
              pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar15;
            }
            pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
            *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((uVar25 != 0) && (pMVar14 != (Mat *)0x0)) {
            if ((int)uVar25 < 1) {
              fVar36 = 1.0;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar26 = (Mat *)bottom_blob->data;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar21) {
                  uVar23 = 0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)&pMVar26->data + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                  } while (uVar21 != uVar23);
                }
                *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
              fVar36 = 1.0;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar19 != pMVar15);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 == (Allocator *)0x0) {
                if (pMVar14 != (Mat *)0x0) {
                  free(pMVar14);
                }
              }
              else {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                pMVar26 = pMVar14;
              }
            }
          }
LAB_0013e4ef:
          bVar29 = false;
        }
        else {
          if (iVar11 == 0 && reduce_c == false) {
            pMVar26 = (Mat *)(ulong)uVar25;
            Mat::create(top_blob,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(ulong)uVar21;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar21) {
                  pMVar15 = (Mat *)0x0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar26 != pMVar15);
                }
                *(float *)((long)pvVar31 + (long)pMVar14 * 4) = fVar36;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar14 != pMVar19);
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar13;
            bVar24 = (byte)iVar11 >> 1 | bVar20;
            if (reduce_c != false || (bVar24 & 1) != 0) {
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)0x1;
                Mat::create((Mat *)&ptr,1,uVar12,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar90._8_4_ = (int)lVar22;
                      auVar90._0_8_ = lVar22;
                      auVar90._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar90 = auVar90 ^ _DAT_0016ebc0;
                      do {
                        auVar185._8_4_ = (int)pMVar26;
                        auVar185._0_8_ = pMVar26;
                        auVar185._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar185 | auVar52) ^ auVar134;
                        iVar11 = auVar90._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar90._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar90._12_4_ || auVar225._8_4_ <= auVar90._8_4_)
                            && auVar225._12_4_ <= auVar90._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar185 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar90._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x3f800000;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x3f800000;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          pvVar31 = pvVar34;
                          do {
                            auVar133 = ZEXT816(0x3f800000);
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              auVar133 = ZEXT816(0x3f800000);
                              do {
                                auVar133._0_4_ =
                                     auVar133._0_4_ * *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            *(int *)((long)ptr +
                                    uVar32 * 4 +
                                    CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15)
                                 = auVar133._0_4_;
                            uVar32 = uVar32 + 1;
                            pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                          } while (uVar32 != uVar23);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar91._8_4_ = (int)lVar33;
                      auVar91._0_8_ = lVar33;
                      auVar91._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar32 = 0;
                      auVar91 = auVar91 ^ _DAT_0016ebc0;
                      do {
                        auVar186._8_4_ = (int)uVar32;
                        auVar186._0_8_ = uVar32;
                        auVar186._12_4_ = (int)(uVar32 >> 0x20);
                        auVar225 = (auVar186 | auVar52) ^ auVar134;
                        iVar11 = auVar91._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar91._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar91._12_4_ || auVar225._8_4_ <= auVar91._8_4_)
                            && auVar225._12_4_ <= auVar91._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar186 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar91._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0x3f800000;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0x3f800000;
                        }
                        uVar32 = uVar32 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          do {
                            *(float *)((long)pvVar34 + uVar32 * 4) =
                                 *(float *)((long)pvVar31 + uVar32 * 4) *
                                 *(float *)((long)pvVar34 + uVar32 * 4);
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                goto LAB_0013e4ef;
              }
              pMVar26 = (Mat *)(ulong)uVar7;
              bVar24 = (byte)iVar11 | bVar8;
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create((Mat *)&ptr,uVar13,1,uVar25,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      lVar22 = (ulong)uVar21 - 1;
                      auVar102._8_4_ = (int)lVar22;
                      auVar102._0_8_ = lVar22;
                      auVar102._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar102 = auVar102 ^ _DAT_0016ebc0;
                      do {
                        auVar197._8_4_ = (int)pMVar26;
                        auVar197._0_8_ = pMVar26;
                        auVar197._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar197 | auVar52) ^ auVar134;
                        iVar11 = auVar102._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar102._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar102._12_4_ || auVar225._8_4_ <= auVar102._8_4_)
                            && auVar225._12_4_ <= auVar102._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar197 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar102._0_4_)
                           ) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x3f800000;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x3f800000;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar21 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar21 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) =
                                     *(float *)((long)pvVar30 + (long)pMVar27 * 4) *
                                     *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar21 = uVar21 + 1;
                            pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                          } while (uVar21 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 +
                                          CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar12 - 1;
                      auVar103._8_4_ = (int)lVar33;
                      auVar103._0_8_ = lVar33;
                      auVar103._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar103 = auVar103 ^ _DAT_0016ebc0;
                      do {
                        auVar198._8_4_ = (int)uVar23;
                        auVar198._0_8_ = uVar23;
                        auVar198._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar198 | auVar52) ^ auVar134;
                        iVar11 = auVar103._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar11 && auVar103._0_4_ < auVar225._0_4_ ||
                                    iVar11 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar103._12_4_ || auVar225._8_4_ <= auVar103._8_4_)
                            && auVar225._12_4_ <= auVar103._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar198 | auVar60) ^ auVar134;
                        iVar9 = auVar225._4_4_;
                        if (iVar9 <= iVar11 && (iVar9 != iVar11 || auVar225._0_4_ <= auVar103._0_4_)
                           ) {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0x3f800000;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0x3f800000;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                    }
                    if (0 < (int)uVar25) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar34 + (long)pMVar15 * 4) =
                                 *(float *)((long)pvVar31 + (long)pMVar15 * 4) *
                                 *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                bVar29 = false;
              }
              else if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,uVar12,sVar2,opt->blob_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                uVar13 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar13) {
                  pvVar34 = top_blob->data;
                  lVar33 = (ulong)uVar13 - 1;
                  auVar109._8_4_ = (int)lVar33;
                  auVar109._0_8_ = lVar33;
                  auVar109._12_4_ = (int)((ulong)lVar33 >> 0x20);
                  uVar23 = 0;
                  auVar109 = auVar109 ^ _DAT_0016ebc0;
                  do {
                    auVar214._8_4_ = (int)uVar23;
                    auVar214._0_8_ = uVar23;
                    auVar214._12_4_ = (int)(uVar23 >> 0x20);
                    auVar225 = (auVar214 | auVar52) ^ auVar134;
                    iVar11 = auVar109._4_4_;
                    iVar9 = auVar109._12_4_;
                    if ((bool)(~(auVar225._4_4_ == iVar11 && auVar109._0_4_ < auVar225._0_4_ ||
                                iVar11 < auVar225._4_4_) & 1)) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x3f800000;
                    }
                    if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar109._8_4_) &&
                        auVar225._12_4_ <= iVar9) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x3f800000;
                    }
                    auVar225 = (auVar214 | auVar60) ^ auVar134;
                    auVar234._0_4_ = -(uint)(auVar109._0_4_ < auVar225._0_4_);
                    auVar234._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                    auVar234._8_4_ = -(uint)(auVar109._8_4_ < auVar225._8_4_);
                    auVar234._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                    iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                    iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                    auVar249._4_4_ = iVar11;
                    auVar249._0_4_ = iVar11;
                    auVar249._8_4_ = iVar9;
                    auVar249._12_4_ = iVar9;
                    auVar215._4_4_ = auVar234._4_4_;
                    auVar215._0_4_ = auVar234._4_4_;
                    auVar215._8_4_ = auVar234._12_4_;
                    auVar215._12_4_ = auVar234._12_4_;
                    auVar216._8_4_ = 0xffffffff;
                    auVar216._0_8_ = 0xffffffffffffffff;
                    auVar216._12_4_ = 0xffffffff;
                    auVar216 = (auVar215 | auVar249 & auVar234) ^ auVar216;
                    if ((auVar216 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x3f800000;
                    }
                    pMVar14 = (Mat *)(ulong)auVar216._8_2_;
                    if ((auVar216 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x3f800000;
                    }
                    uVar23 = uVar23 + 4;
                  } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
                }
                pMVar26 = pMVar14;
                if ((int)uVar25 < 1) goto LAB_0013b3d3;
                sVar2 = bottom_blob->elemsize;
                sVar3 = bottom_blob->cstep;
                pvVar34 = bottom_blob->data;
                pMVar26 = (Mat *)top_blob->data;
                pMVar14 = (Mat *)0x0;
                in_R9D = 0;
                do {
                  if (0 < (int)uVar21) {
                    uVar23 = 0;
                    do {
                      *(float *)((long)&pMVar26->data + uVar23 * 4) =
                           *(float *)((long)pvVar34 + uVar23 * 4) *
                           *(float *)((long)&pMVar26->data + uVar23 * 4);
                      uVar23 = uVar23 + 1;
                    } while (uVar21 != uVar23);
                  }
                  pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                  bVar29 = false;
                } while (pMVar14 != pMVar19);
              }
              else {
                bVar29 = true;
                if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar26 = (Mat *)(ulong)uVar13;
                  Mat::create(top_blob,uVar13,uVar25,sVar2,opt->blob_allocator);
                  auVar52 = _DAT_0016ed80;
                  auVar60 = _DAT_0016ed70;
                  auVar134 = _DAT_0016ebc0;
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar21) {
                    pvVar34 = top_blob->data;
                    lVar33 = (ulong)uVar21 - 1;
                    auVar85._8_4_ = (int)lVar33;
                    auVar85._0_8_ = lVar33;
                    auVar85._12_4_ = (int)((ulong)lVar33 >> 0x20);
                    uVar23 = 0;
                    auVar85 = auVar85 ^ _DAT_0016ebc0;
                    do {
                      auVar178._8_4_ = (int)uVar23;
                      auVar178._0_8_ = uVar23;
                      auVar178._12_4_ = (int)(uVar23 >> 0x20);
                      auVar225 = (auVar178 | auVar52) ^ auVar134;
                      iVar11 = auVar85._4_4_;
                      iVar9 = auVar85._12_4_;
                      if ((bool)(~(auVar225._4_4_ == iVar11 && auVar85._0_4_ < auVar225._0_4_ ||
                                  iVar11 < auVar225._4_4_) & 1)) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x3f800000;
                      }
                      if ((auVar225._12_4_ != iVar9 || auVar225._8_4_ <= auVar85._8_4_) &&
                          auVar225._12_4_ <= iVar9) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x3f800000;
                      }
                      auVar225 = (auVar178 | auVar60) ^ auVar134;
                      auVar228._0_4_ = -(uint)(auVar85._0_4_ < auVar225._0_4_);
                      auVar228._4_4_ = -(uint)(iVar11 < auVar225._4_4_);
                      auVar228._8_4_ = -(uint)(auVar85._8_4_ < auVar225._8_4_);
                      auVar228._12_4_ = -(uint)(iVar9 < auVar225._12_4_);
                      iVar11 = -(uint)(auVar225._4_4_ == iVar11);
                      iVar9 = -(uint)(auVar225._12_4_ == iVar9);
                      auVar243._4_4_ = iVar11;
                      auVar243._0_4_ = iVar11;
                      auVar243._8_4_ = iVar9;
                      auVar243._12_4_ = iVar9;
                      auVar179._4_4_ = auVar228._4_4_;
                      auVar179._0_4_ = auVar228._4_4_;
                      auVar179._8_4_ = auVar228._12_4_;
                      auVar179._12_4_ = auVar228._12_4_;
                      auVar180._8_4_ = 0xffffffff;
                      auVar180._0_8_ = 0xffffffffffffffff;
                      auVar180._12_4_ = 0xffffffff;
                      auVar180 = (auVar179 | auVar243 & auVar228) ^ auVar180;
                      if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x3f800000;
                      }
                      pMVar26 = (Mat *)(ulong)auVar180._8_2_;
                      if ((auVar180 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x3f800000;
                      }
                      uVar23 = uVar23 + 4;
                    } while ((uVar21 + 3 & 0xfffffffc) != uVar23);
                  }
                  if ((int)uVar25 < 1) goto LAB_0013b3d3;
                  pvVar34 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pMVar26 = (Mat *)top_blob->data;
                  iVar11 = top_blob->w;
                  sVar3 = top_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  pMVar15 = (Mat *)0x0;
                  in_R9D = 0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar25 = 0;
                      pvVar31 = pvVar34;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar26->data + (long)pMVar27 * 4) =
                                 *(float *)((long)pvVar31 + (long)pMVar27 * 4) *
                                 *(float *)((long)&pMVar26->data + (long)pMVar27 * 4);
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar14 != pMVar27);
                        }
                        uVar25 = uVar25 + 1;
                        pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar13 * 4);
                      } while (uVar25 != uVar12);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar4);
                    pMVar26 = (Mat *)((long)&pMVar26->data + (long)iVar11 * sVar3);
                    bVar29 = false;
                  } while (pMVar15 != pMVar19);
                }
              }
              goto LAB_0013e4f3;
            }
            pMVar26 = (Mat *)(ulong)uVar12;
            Mat::create(top_blob,uVar12,uVar25,sVar2,opt->blob_allocator);
            if (0 < (int)uVar25) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)((long)top_blob->w * top_blob->elemsize);
              sVar3 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar12) {
                  uVar32 = 0;
                  pvVar30 = pvVar34;
                  do {
                    auVar130 = ZEXT816(0x3f800000);
                    if (0 < (int)uVar13) {
                      pMVar27 = (Mat *)0x0;
                      auVar130 = ZEXT816(0x3f800000);
                      do {
                        auVar130._0_4_ =
                             auVar130._0_4_ * *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                         auVar130._0_4_;
                    uVar32 = uVar32 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                  } while (uVar32 != uVar23);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
            }
          }
LAB_0013b3d3:
          bVar29 = false;
          in_R9D = 0;
        }
LAB_0013e4f3:
        if (!bVar29) break;
      }
    }
    else {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        iVar10 = bottom_blob->h;
        pMVar19 = (Mat *)(long)iVar10;
        auVar43._8_4_ = 0xffffffff;
        auVar43._0_8_ = 0xffffffffffffffff;
        auVar43._12_4_ = 0xffffffff;
        auVar44._0_8_ = SUB168(auVar43 ^ auVar134,0) << 0x3f;
        auVar44._8_8_ = SUB168(auVar43 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar44);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (iVar10 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar15 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar15 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar27;
            }
            pbVar18 = (bool *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar10 != 0) && (pMVar15 != (Mat *)0x0)) {
            if (iVar10 < 1) {
              fVar36 = 1.0;
            }
            else {
              pvVar34 = bottom_blob->data;
              pMVar26 = (Mat *)((long)bottom_blob->w * bottom_blob->elemsize);
              pMVar27 = (Mat *)0x0;
              do {
                auVar118 = ZEXT816(0x3f800000);
                if (0 < (int)uVar13) {
                  pMVar28 = (Mat *)0x0;
                  auVar118 = ZEXT816(0x3f800000);
                  do {
                    auVar118._0_4_ = auVar118._0_4_ * *(float *)((long)pvVar34 + (long)pMVar28 * 4);
                    pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                  } while (pMVar14 != pMVar28);
                }
                *(int *)((long)&pMVar15->data + (long)pMVar27 * 4) = auVar118._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
              } while (pMVar27 != pMVar19);
              fVar36 = 1.0;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)&pMVar15->data + (long)pMVar14 * 4);
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              } while (pMVar19 != pMVar14);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                bVar29 = false;
                pMVar26 = pMVar15;
                goto LAB_00138d37;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
              }
            }
          }
          bVar29 = false;
        }
        else if (((bVar20 | (byte)iVar9 >> 1) & 1) == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,iVar10,sVar2,opt->blob_allocator);
          if (iVar10 < 1) {
            bVar29 = false;
            in_R9D = 0;
          }
          else {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              auVar112 = ZEXT816(0x3f800000);
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                auVar112 = ZEXT816(0x3f800000);
                do {
                  auVar112._0_4_ = auVar112._0_4_ * *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              *(int *)((long)pvVar31 + (long)pMVar26 * 4) = auVar112._0_4_;
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
LAB_001372fc:
            bVar29 = false;
            in_R9D = 0;
          }
        }
        else if (((bVar8 | (byte)iVar9) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,1,sVar2,opt->blob_allocator);
          auVar225 = _DAT_0016ed80;
          auVar52 = _DAT_0016ed70;
          auVar60 = _DAT_0016ebc0;
          uVar12 = top_blob->c * (int)top_blob->cstep;
          if (0 < (int)uVar12) {
            pvVar34 = top_blob->data;
            lVar33 = (ulong)uVar12 - 1;
            auVar55._8_4_ = (int)lVar33;
            auVar55._0_8_ = lVar33;
            auVar55._12_4_ = (int)((ulong)lVar33 >> 0x20);
            uVar23 = 0;
            auVar55 = auVar55 ^ _DAT_0016ebc0;
            do {
              auVar151._8_4_ = (int)uVar23;
              auVar151._0_8_ = uVar23;
              auVar151._12_4_ = (int)(uVar23 >> 0x20);
              auVar220 = (auVar151 | auVar225) ^ auVar60;
              iVar9 = auVar55._4_4_;
              iVar217 = auVar55._12_4_;
              if ((bool)(~(auVar220._4_4_ == iVar9 && auVar55._0_4_ < auVar220._0_4_ ||
                          iVar9 < auVar220._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x3f800000;
              }
              if ((auVar220._12_4_ != iVar217 || auVar220._8_4_ <= auVar55._8_4_) &&
                  auVar220._12_4_ <= iVar217) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x3f800000;
              }
              auVar220 = (auVar151 | auVar52) ^ auVar60;
              auVar221._0_4_ = -(uint)(auVar55._0_4_ < auVar220._0_4_);
              auVar221._4_4_ = -(uint)(iVar9 < auVar220._4_4_);
              auVar221._8_4_ = -(uint)(auVar55._8_4_ < auVar220._8_4_);
              auVar221._12_4_ = -(uint)(iVar217 < auVar220._12_4_);
              iVar9 = -(uint)(auVar220._4_4_ == iVar9);
              iVar217 = -(uint)(auVar220._12_4_ == iVar217);
              auVar237._4_4_ = iVar9;
              auVar237._0_4_ = iVar9;
              auVar237._8_4_ = iVar217;
              auVar237._12_4_ = iVar217;
              auVar152._4_4_ = auVar221._4_4_;
              auVar152._0_4_ = auVar221._4_4_;
              auVar152._8_4_ = auVar221._12_4_;
              auVar152._12_4_ = auVar221._12_4_;
              auVar153._8_4_ = 0xffffffff;
              auVar153._0_8_ = 0xffffffffffffffff;
              auVar153._12_4_ = 0xffffffff;
              auVar153 = (auVar152 | auVar237 & auVar221) ^ auVar153;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x3f800000;
              }
              pMVar26 = (Mat *)(ulong)auVar153._8_2_;
              if ((auVar153 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x3f800000;
              }
              uVar23 = uVar23 + 4;
            } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
          }
          if (0 < iVar10) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar26 = (Mat *)0x0;
            do {
              if (0 < (int)uVar13) {
                pMVar15 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar31 + (long)pMVar15 * 4) =
                       *(float *)((long)pvVar34 + (long)pMVar15 * 4) *
                       *(float *)((long)pvVar31 + (long)pMVar15 * 4);
                  pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                } while (pMVar14 != pMVar15);
              }
              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar26 != pMVar19);
            goto LAB_001372fc;
          }
          bVar29 = false;
          in_R9D = 0;
        }
        else {
          bVar29 = true;
        }
LAB_00138d37:
        if (!bVar29) break;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) {
LAB_0013638e:
          fVar36 = 1.0;
        }
        else {
          fVar36 = 1.0;
          lVar33 = 0;
          do {
            fVar36 = fVar36 * *(float *)((long)bottom_blob->data + lVar33 * 4);
            lVar33 = lVar33 + 1;
          } while (iVar11 != lVar33);
        }
LAB_00136396:
        *(float *)top_blob->data = fVar36;
        goto LAB_0013e4f8;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        lVar33 = (long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        iVar11 = bottom_blob->c;
        pMVar19 = (Mat *)(long)iVar11;
        uVar25 = uVar12 * uVar13;
        auVar67._8_4_ = 0xffffffff;
        auVar67._0_8_ = 0xffffffffffffffff;
        auVar67._12_4_ = 0xffffffff;
        auVar68._0_8_ = SUB168(auVar67 ^ auVar134,0) << 0x3f;
        auVar68._8_8_ = SUB168(auVar67 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(uVar25,auVar68);
        bVar16 = reduce_c ^ 1;
        if (iVar9 == 0 && bVar16 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (iVar11 == 0) {
            pbVar18 = (bool *)0x0;
            pMVar14 = (Mat *)0x0;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar15 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar15);
              pMVar14 = (Mat *)ptr;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar14 = (Mat *)ptr;
              }
            }
            else {
              pMVar14 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))();
              pMVar26 = pMVar15;
            }
            pbVar18 = (bool *)((long)&pMVar14->data + uVar23);
            *(undefined4 *)((long)&pMVar14->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar11 != 0) && (pMVar14 != (Mat *)0x0)) {
            if (iVar11 < 1) {
              fVar36 = 1.0;
            }
            else {
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar26 = (Mat *)bottom_blob->data;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)&pMVar26->data + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)&pMVar14->data + (long)pMVar15 * 4) = fVar36;
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar26 = (Mat *)((long)&pMVar26->data + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
              fVar36 = 1.0;
              pMVar15 = (Mat *)0x0;
              do {
                fVar36 = fVar36 * *(float *)((long)&pMVar14->data + (long)pMVar15 * 4);
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              } while (pMVar19 != pMVar15);
            }
            *(float *)top_blob->data = fVar36;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 == (Allocator *)0x0) {
                if (pMVar14 != (Mat *)0x0) {
                  free(pMVar14);
                }
              }
              else {
                (**(code **)(*(long *)pAVar6 + 0x18))();
                pMVar26 = pMVar14;
              }
            }
          }
LAB_0013d31b:
          bVar29 = false;
        }
        else {
          if (iVar9 == 0 && reduce_c == false) {
            pMVar26 = (Mat *)0x1;
            Mat::create(top_blob,1,1,iVar11,sVar2,opt->blob_allocator);
            if (0 < iVar11) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar14 = (Mat *)0x0;
              do {
                fVar36 = 1.0;
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  fVar36 = 1.0;
                  do {
                    fVar36 = fVar36 * *(float *)((long)pvVar34 + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)pvVar31 + (long)pMVar26 * (long)pMVar14) = fVar36;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar14 != pMVar19);
            }
          }
          else {
            pMVar14 = (Mat *)(ulong)uVar13;
            bVar24 = (byte)iVar9 >> 1 | bVar20;
            if (reduce_c != false || (bVar24 & 1) != 0) {
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,1,uVar12,1,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)0x1;
                Mat::create((Mat *)&ptr,1,uVar12,iVar11,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar25 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar25) {
                      lVar22 = (ulong)uVar25 - 1;
                      auVar75._8_4_ = (int)lVar22;
                      auVar75._0_8_ = lVar22;
                      auVar75._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar75 = auVar75 ^ _DAT_0016ebc0;
                      do {
                        auVar170._8_4_ = (int)pMVar26;
                        auVar170._0_8_ = pMVar26;
                        auVar170._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar170 | auVar52) ^ auVar134;
                        iVar9 = auVar75._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar75._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar75._12_4_ || auVar225._8_4_ <= auVar75._8_4_)
                            && auVar225._12_4_ <= auVar75._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar170 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar75._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x3f800000;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x3f800000;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < iVar11) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          pvVar31 = pvVar34;
                          do {
                            auVar127 = ZEXT816(0x3f800000);
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              auVar127 = ZEXT816(0x3f800000);
                              do {
                                auVar127._0_4_ =
                                     auVar127._0_4_ * *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            *(int *)((long)ptr +
                                    uVar32 * 4 +
                                    CONCAT44(uStack_84,uStack_88) * local_68._8_8_ * (long)pMVar15)
                                 = auVar127._0_4_;
                            uVar32 = uVar32 + 1;
                            pvVar31 = (void *)((long)pvVar31 + lVar33 * 4);
                          } while (uVar32 != uVar23);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar76._8_4_ = (int)lVar33;
                      auVar76._0_8_ = lVar33;
                      auVar76._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar32 = 0;
                      auVar76 = auVar76 ^ _DAT_0016ebc0;
                      do {
                        auVar171._8_4_ = (int)uVar32;
                        auVar171._0_8_ = uVar32;
                        auVar171._12_4_ = (int)(uVar32 >> 0x20);
                        auVar225 = (auVar171 | auVar52) ^ auVar134;
                        iVar9 = auVar76._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar76._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar76._12_4_ || auVar225._8_4_ <= auVar76._8_4_)
                            && auVar225._12_4_ <= auVar76._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar32 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar171 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar76._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4) = 0x3f800000;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar32 * 4 + 4) = 0x3f800000;
                        }
                        uVar32 = uVar32 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar32);
                    }
                    if (0 < iVar11) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar32 = 0;
                          do {
                            *(float *)((long)pvVar34 + uVar32 * 4) =
                                 *(float *)((long)pvVar31 + uVar32 * 4) *
                                 *(float *)((long)pvVar34 + uVar32 * 4);
                            uVar32 = uVar32 + 1;
                          } while (uVar23 != uVar32);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
              }
              else {
                pMVar26 = (Mat *)(ulong)uVar7;
                bVar24 = (byte)iVar9 | bVar8;
                if ((bVar24 & 1) != 0 || bVar16 != 0) {
                  if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                    Mat::create(top_blob,uVar13,uVar12,1,sVar2,opt->blob_allocator);
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar13 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar13) {
                      pvVar34 = top_blob->data;
                      lVar33 = (ulong)uVar13 - 1;
                      auVar106._8_4_ = (int)lVar33;
                      auVar106._0_8_ = lVar33;
                      auVar106._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar106 = auVar106 ^ _DAT_0016ebc0;
                      do {
                        auVar205._8_4_ = (int)uVar23;
                        auVar205._0_8_ = uVar23;
                        auVar205._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar205 | auVar52) ^ auVar134;
                        iVar9 = auVar106._4_4_;
                        iVar10 = auVar106._12_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar106._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != iVar10 || auVar225._8_4_ <= auVar106._8_4_) &&
                            auVar225._12_4_ <= iVar10) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar205 | auVar60) ^ auVar134;
                        auVar231._0_4_ = -(uint)(auVar106._0_4_ < auVar225._0_4_);
                        auVar231._4_4_ = -(uint)(iVar9 < auVar225._4_4_);
                        auVar231._8_4_ = -(uint)(auVar106._8_4_ < auVar225._8_4_);
                        auVar231._12_4_ = -(uint)(iVar10 < auVar225._12_4_);
                        iVar9 = -(uint)(auVar225._4_4_ == iVar9);
                        iVar10 = -(uint)(auVar225._12_4_ == iVar10);
                        auVar246._4_4_ = iVar9;
                        auVar246._0_4_ = iVar9;
                        auVar246._8_4_ = iVar10;
                        auVar246._12_4_ = iVar10;
                        auVar206._4_4_ = auVar231._4_4_;
                        auVar206._0_4_ = auVar231._4_4_;
                        auVar206._8_4_ = auVar231._12_4_;
                        auVar206._12_4_ = auVar231._12_4_;
                        auVar207._8_4_ = 0xffffffff;
                        auVar207._0_8_ = 0xffffffffffffffff;
                        auVar207._12_4_ = 0xffffffff;
                        auVar207 = (auVar206 | auVar246 & auVar231) ^ auVar207;
                        if ((auVar207 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 8) = 0x3f800000;
                        }
                        pMVar14 = (Mat *)(ulong)auVar207._8_2_;
                        if ((auVar207 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          *(undefined4 *)((long)pvVar34 + uVar23 * 4 + 0xc) = 0x3f800000;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar13 + 3 & 0xfffffffc) != uVar23);
                    }
                    pMVar26 = pMVar14;
                    if (iVar11 < 1) goto LAB_00139130;
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    pvVar34 = bottom_blob->data;
                    pMVar26 = (Mat *)top_blob->data;
                    pMVar14 = (Mat *)0x0;
                    in_R9D = 0;
                    do {
                      if (0 < (int)uVar25) {
                        uVar23 = 0;
                        do {
                          *(float *)((long)&pMVar26->data + uVar23 * 4) =
                               *(float *)((long)pvVar34 + uVar23 * 4) *
                               *(float *)((long)&pMVar26->data + uVar23 * 4);
                          uVar23 = uVar23 + 1;
                        } while (uVar25 != uVar23);
                      }
                      pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                      pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                      bVar29 = false;
                    } while (pMVar14 != pMVar19);
                  }
                  else {
                    bVar29 = true;
                    if (reduce_c == false && (bVar24 & 1) == 0) {
                      pMVar26 = (Mat *)(ulong)uVar13;
                      Mat::create(top_blob,uVar13,1,iVar11,sVar2,opt->blob_allocator);
                      auVar52 = _DAT_0016ed80;
                      auVar60 = _DAT_0016ed70;
                      auVar134 = _DAT_0016ebc0;
                      sVar2 = top_blob->cstep;
                      uVar25 = top_blob->c * (int)sVar2;
                      if (0 < (int)uVar25) {
                        pvVar34 = top_blob->data;
                        lVar33 = (ulong)uVar25 - 1;
                        auVar69._8_4_ = (int)lVar33;
                        auVar69._0_8_ = lVar33;
                        auVar69._12_4_ = (int)((ulong)lVar33 >> 0x20);
                        pMVar26 = (Mat *)0x0;
                        auVar69 = auVar69 ^ _DAT_0016ebc0;
                        do {
                          auVar165._8_4_ = (int)pMVar26;
                          auVar165._0_8_ = pMVar26;
                          auVar165._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                          auVar225 = (auVar165 | auVar52) ^ auVar134;
                          iVar9 = auVar69._4_4_;
                          if ((bool)(~(auVar225._4_4_ == iVar9 && auVar69._0_4_ < auVar225._0_4_ ||
                                      iVar9 < auVar225._4_4_) & 1)) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4) = 0x3f800000;
                          }
                          if ((auVar225._12_4_ != auVar69._12_4_ || auVar225._8_4_ <= auVar69._8_4_)
                              && auVar225._12_4_ <= auVar69._12_4_) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 4) = 0x3f800000;
                          }
                          auVar225 = (auVar165 | auVar60) ^ auVar134;
                          iVar10 = auVar225._4_4_;
                          if (iVar10 <= iVar9 &&
                              (iVar10 != iVar9 || auVar225._0_4_ <= auVar69._0_4_)) {
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 8) = 0x3f800000;
                            *(undefined4 *)((long)pvVar34 + (long)pMVar26 * 4 + 0xc) = 0x3f800000;
                          }
                          pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                        } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                      }
                      if (iVar11 < 1) goto LAB_00139130;
                      pvVar34 = bottom_blob->data;
                      pvVar31 = top_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      sVar3 = top_blob->elemsize;
                      pMVar15 = (Mat *)0x0;
                      in_R9D = 0;
                      do {
                        if (0 < (int)uVar12) {
                          uVar25 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) =
                                     *(float *)((long)pvVar30 + (long)pMVar27 * 4) *
                                     *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar25 = uVar25 + 1;
                            pvVar30 = (void *)((long)pvVar30 + (long)(int)uVar13 * 4);
                          } while (uVar25 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 + sVar2 * sVar3);
                        bVar29 = false;
                      } while (pMVar15 != pMVar19);
                    }
                  }
                  goto LAB_0013e4f3;
                }
                Mat::create(top_blob,uVar13,1,1,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = (undefined1  [16])0x0;
                local_68._0_16_ = (undefined1  [16])0x0;
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create((Mat *)&ptr,uVar13,1,iVar11,sVar2,opt->workspace_allocator);
                auVar52 = _DAT_0016ed80;
                auVar60 = _DAT_0016ed70;
                auVar134 = _DAT_0016ebc0;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)(long)(int)local_68._4_4_;
                  if (local_68._8_8_ * (long)pMVar26 != 0) {
                    uVar25 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar25) {
                      lVar22 = (ulong)uVar25 - 1;
                      auVar96._8_4_ = (int)lVar22;
                      auVar96._0_8_ = lVar22;
                      auVar96._12_4_ = (int)((ulong)lVar22 >> 0x20);
                      pMVar26 = (Mat *)0x0;
                      auVar96 = auVar96 ^ _DAT_0016ebc0;
                      do {
                        auVar191._8_4_ = (int)pMVar26;
                        auVar191._0_8_ = pMVar26;
                        auVar191._12_4_ = (int)((ulong)pMVar26 >> 0x20);
                        auVar225 = (auVar191 | auVar52) ^ auVar134;
                        iVar9 = auVar96._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar96._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar96._12_4_ || auVar225._8_4_ <= auVar96._8_4_)
                            && auVar225._12_4_ <= auVar96._12_4_) {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar191 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar96._0_4_))
                        {
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 8) = 0x3f800000;
                          *(undefined4 *)((long)ptr + (long)pMVar26 * 4 + 0xc) = 0x3f800000;
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 4);
                      } while ((Mat *)(ulong)(uVar25 + 3 & 0xfffffffc) != pMVar26);
                    }
                    if (0 < iVar11) {
                      pvVar34 = bottom_blob->data;
                      pMVar26 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      pMVar15 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar12) {
                          uVar25 = 0;
                          pvVar30 = pvVar34;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar27 = (Mat *)0x0;
                              do {
                                *(float *)((long)pvVar31 + (long)pMVar27 * 4) =
                                     *(float *)((long)pvVar30 + (long)pMVar27 * 4) *
                                     *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                              } while (pMVar14 != pMVar27);
                            }
                            uVar25 = uVar25 + 1;
                            pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                          } while (uVar25 != uVar12);
                        }
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        pvVar34 = (void *)((long)pvVar34 + (long)pMVar26);
                        pvVar31 = (void *)((long)pvVar31 +
                                          CONCAT44(uStack_84,uStack_88) * local_68._8_8_);
                      } while (pMVar15 != pMVar19);
                    }
                    auVar52 = _DAT_0016ed80;
                    auVar60 = _DAT_0016ed70;
                    auVar134 = _DAT_0016ebc0;
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)top_blob->data;
                      lVar33 = (ulong)uVar12 - 1;
                      auVar97._8_4_ = (int)lVar33;
                      auVar97._0_8_ = lVar33;
                      auVar97._12_4_ = (int)((ulong)lVar33 >> 0x20);
                      uVar23 = 0;
                      auVar97 = auVar97 ^ _DAT_0016ebc0;
                      do {
                        auVar192._8_4_ = (int)uVar23;
                        auVar192._0_8_ = uVar23;
                        auVar192._12_4_ = (int)(uVar23 >> 0x20);
                        auVar225 = (auVar192 | auVar52) ^ auVar134;
                        iVar9 = auVar97._4_4_;
                        if ((bool)(~(auVar225._4_4_ == iVar9 && auVar97._0_4_ < auVar225._0_4_ ||
                                    iVar9 < auVar225._4_4_) & 1)) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4) = 0x3f800000;
                        }
                        if ((auVar225._12_4_ != auVar97._12_4_ || auVar225._8_4_ <= auVar97._8_4_)
                            && auVar225._12_4_ <= auVar97._12_4_) {
                          *(undefined4 *)((long)&pMVar26->data + uVar23 * 4 + 4) = 0x3f800000;
                        }
                        auVar225 = (auVar192 | auVar60) ^ auVar134;
                        iVar10 = auVar225._4_4_;
                        if (iVar10 <= iVar9 && (iVar10 != iVar9 || auVar225._0_4_ <= auVar97._0_4_))
                        {
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4) = 0x3f800000;
                          *(undefined4 *)((long)&pMVar26->refcount + uVar23 * 4 + 4) = 0x3f800000;
                        }
                        uVar23 = uVar23 + 4;
                      } while ((uVar12 + 3 & 0xfffffffc) != uVar23);
                    }
                    if (0 < iVar11) {
                      pvVar34 = top_blob->data;
                      pMVar26 = (Mat *)0x0;
                      pvVar31 = ptr;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar34 + (long)pMVar15 * 4) =
                                 *(float *)((long)pvVar31 + (long)pMVar15 * 4) *
                                 *(float *)((long)pvVar34 + (long)pMVar15 * 4);
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        pvVar31 = (void *)((long)pvVar31 +
                                          local_68._8_8_ * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar26 != pMVar19);
                    }
                    in_R9D = 0;
                  }
                }
              }
              Mat::~Mat((Mat *)&ptr);
              goto LAB_0013d31b;
            }
            pMVar26 = (Mat *)0x1;
            Mat::create(top_blob,1,uVar12,iVar11,sVar2,opt->blob_allocator);
            if (0 < iVar11) {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              pvVar31 = top_blob->data;
              pMVar26 = (Mat *)(top_blob->elemsize * top_blob->cstep);
              sVar3 = bottom_blob->cstep;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar12) {
                  uVar32 = 0;
                  pvVar30 = pvVar34;
                  do {
                    auVar124 = ZEXT816(0x3f800000);
                    if (0 < (int)uVar13) {
                      pMVar27 = (Mat *)0x0;
                      auVar124 = ZEXT816(0x3f800000);
                      do {
                        auVar124._0_4_ =
                             auVar124._0_4_ * *(float *)((long)pvVar30 + (long)pMVar27 * 4);
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    *(int *)((long)pvVar31 + uVar32 * 4 + (long)pMVar26 * (long)pMVar15) =
                         auVar124._0_4_;
                    uVar32 = uVar32 + 1;
                    pvVar30 = (void *)((long)pvVar30 + lVar33 * 4);
                  } while (uVar32 != uVar23);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar15 != pMVar19);
            }
          }
LAB_00139130:
          bVar29 = false;
          in_R9D = 0;
        }
        goto LAB_0013e4f3;
      }
    }
LAB_0013e4f8:
    in_R9D = 0;
    break;
  case 7:
    post_process = (undefined1)this->keepdims;
    auVar138._0_8_ = lVar22 << 0x3f;
    auVar138._8_8_ = lVar33 << 0x3f;
    uVar17 = movmskpd(0x16f090,auVar138);
    bVar8 = (byte)uVar17;
    fVar35 = 1.0;
LAB_00135d07:
    iVar11 = reduction<ncnn::reduction_op_asum<float>,std::plus<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar35,(bool)(bVar8 >> 1),(bool)(bVar8 & 1),reduce_c,
                        (bool)post_process,in_XMM1._0_4_,(int)opt,in_stack_ffffffffffffff10);
    return iVar11;
  case 8:
    if (this->keepdims == 0) {
      auVar143._0_8_ = lVar22 << 0x3f;
      auVar143._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar143);
      iVar11 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
    }
    else {
      auVar140._0_8_ = lVar22 << 0x3f;
      auVar140._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar140);
      iVar11 = reduction_op_keepdims<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
    }
    if (iVar11 != 0) {
      return -100;
    }
    iVar11 = top_blob->dims;
    if (iVar11 != 3) {
      if (iVar11 == 2) {
        uVar13 = top_blob->h * top_blob->w;
        if (0 < (int)uVar13) {
          pvVar34 = top_blob->data;
          uVar23 = 0;
          do {
            *(float *)((long)pvVar34 + uVar23 * 4) = SQRT(*(float *)((long)pvVar34 + uVar23 * 4));
            uVar23 = uVar23 + 1;
          } while (uVar13 != uVar23);
          return 0;
        }
        return 0;
      }
      if (iVar11 != 1) {
        return 0;
      }
      iVar11 = top_blob->w;
      if (0 < (long)iVar11) {
        pvVar34 = top_blob->data;
        lVar33 = 0;
        do {
          *(float *)((long)pvVar34 + lVar33 * 4) = SQRT(*(float *)((long)pvVar34 + lVar33 * 4));
          lVar33 = lVar33 + 1;
        } while (iVar11 != lVar33);
        return 0;
      }
      return 0;
    }
    uVar13 = top_blob->c;
    uVar12 = top_blob->h * top_blob->w;
    if ((ulong)uVar13 != 1) {
      if (0 < (int)uVar13) {
        pvVar34 = top_blob->data;
        sVar2 = top_blob->elemsize;
        sVar3 = top_blob->cstep;
        uVar23 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar32 = 0;
            do {
              *(float *)((long)pvVar34 + uVar32 * 4) = SQRT(*(float *)((long)pvVar34 + uVar32 * 4));
              uVar32 = uVar32 + 1;
            } while (uVar12 != uVar32);
          }
          uVar23 = uVar23 + 1;
          pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
        } while (uVar23 != uVar13);
        return 0;
      }
      return 0;
    }
    if (0 < (int)uVar12) {
      pvVar34 = top_blob->data;
      uVar23 = 0;
      do {
        *(float *)((long)pvVar34 + uVar23 * 4) = SQRT(*(float *)((long)pvVar34 + uVar23 * 4));
        uVar23 = uVar23 + 1;
      } while (uVar12 != uVar23);
      return 0;
    }
    return 0;
  case 9:
    if (this->keepdims == 0) {
      auVar141._0_8_ = lVar22 << 0x3f;
      auVar141._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar141);
      pMVar26 = top_blob;
      in_R9D = reduction_op<std::plus<float>,std::plus<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
      in_XMM0_Da = extraout_XMM0_Da_00;
    }
    else {
      auVar136._0_8_ = lVar22 << 0x3f;
      auVar136._8_8_ = lVar33 << 0x3f;
      uVar17 = movmskpd(0x16f090,auVar136);
      pMVar26 = top_blob;
      in_R9D = reduction_op_keepdims<std::plus<float>,std::plus<float>>
                         (bottom_blob,top_blob,in_XMM0_Da,(bool)((byte)uVar17 >> 1),
                          (bool)((byte)uVar17 & 1),reduce_c,opt);
      in_XMM0_Da = extraout_XMM0_Da;
    }
    goto joined_r0x0013d2c9;
  case 10:
    sVar2 = bottom_blob->elemsize;
    if (this->keepdims == 0) {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar14 = (Mat *)(ulong)uVar13;
        iVar9 = bottom_blob->h;
        pMVar19 = (Mat *)(long)iVar9;
        auVar52._8_4_ = 0xffffffff;
        auVar52._0_8_ = 0xffffffffffffffff;
        auVar52._12_4_ = 0xffffffff;
        auVar60._0_8_ = SUB168(auVar52 ^ auVar134,0) << 0x3f;
        auVar60._8_8_ = SUB168(auVar52 ^ auVar134,8) << 0x3f;
        iVar10 = movmskpd(iVar9,auVar60);
        if (iVar10 == 0) {
          pMVar15 = (Mat *)0x1;
          Mat::create(top_blob,1,sVar2,opt->blob_allocator);
          local_50 = (Mat *)opt->workspace_allocator;
          if (iVar9 == 0) {
            pMVar27 = (Mat *)0x0;
            pMVar26 = (Mat *)0x0;
            auVar60 = extraout_XMM0_00;
          }
          else {
            uVar23 = sVar2 * (long)pMVar19 + 3 & 0xfffffffffffffffc;
            pMVar27 = (Mat *)(uVar23 + 4);
            if (local_50 == (Mat *)0x0) {
              ptr = (void *)0x0;
              pMVar15 = (Mat *)0x10;
              iVar10 = posix_memalign(&ptr,0x10,(size_t)pMVar27);
              pMVar26 = (Mat *)ptr;
              auVar60 = extraout_XMM0_08;
              if (iVar10 != 0) {
                ptr = (void *)0x0;
                pMVar26 = (Mat *)ptr;
              }
            }
            else {
              pMVar26 = (Mat *)(**(code **)((long)local_50->data + 0x10))();
              auVar60._8_8_ = extraout_XMM0_Qb_00;
              auVar60._0_8_ = extraout_XMM0_Qa_00;
              pMVar15 = pMVar27;
            }
            pMVar27 = (Mat *)((long)&pMVar26->data + uVar23);
            *(undefined4 *)((long)&pMVar26->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar9 != 0) && (pMVar26 != (Mat *)0x0)) {
            if (iVar9 < 1) {
              auVar60 = ZEXT816(0);
            }
            else {
              pvVar34 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              pMVar28 = (Mat *)0x0;
              local_48 = pMVar27;
              do {
                fVar35 = 0.0;
                if (0 < (int)uVar13) {
                  pMVar27 = (Mat *)0x0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar34 + (long)pMVar27 * 4));
                    fVar35 = fVar35 + fVar36;
                    pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                  } while (pMVar14 != pMVar27);
                }
                *(float *)((long)&pMVar26->data + (long)pMVar28 * 4) = fVar35;
                pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
              } while (pMVar28 != pMVar19);
              auVar60 = ZEXT816(0);
              pMVar14 = (Mat *)0x0;
              do {
                auVar60._0_4_ = auVar60._0_4_ + *(float *)((long)&pMVar26->data + (long)pMVar14 * 4)
                ;
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pMVar27 = local_48;
              } while (pMVar19 != pMVar14);
            }
            *(int *)top_blob->data = auVar60._0_4_;
            in_R9D = 0;
          }
          if (pMVar27 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMVar27->data = *(int *)&pMVar27->data + -1;
            UNLOCK();
            if (*(int *)&pMVar27->data == 0) {
              if (local_50 != (Mat *)0x0) {
                auVar60._0_8_ = (**(code **)((long)local_50->data + 0x18))();
                auVar60._8_8_ = extraout_XMM0_Qb_04;
                iVar9 = 0;
                goto LAB_0013b4f9;
              }
              if (pMVar26 != (Mat *)0x0) {
                free(pMVar26);
                auVar60 = extraout_XMM0_16;
              }
            }
          }
LAB_0013b4f4:
          pMVar26 = pMVar15;
          iVar9 = 0;
        }
        else if (((bVar20 | (byte)iVar10 >> 1) & 1) == 0) {
          pMVar26 = pMVar19;
          Mat::create(top_blob,iVar9,sVar2,opt->blob_allocator);
          if (0 < iVar9) {
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            pMVar15 = (Mat *)0x0;
            do {
              auVar60 = ZEXT816(0);
              if (0 < (int)uVar13) {
                pMVar27 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar27 * 4));
                  auVar60 = ZEXT416((uint)(auVar60._0_4_ + fVar35));
                  pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                } while (pMVar14 != pMVar27);
              }
              *(int *)((long)pvVar31 + (long)pMVar15 * 4) = auVar60._0_4_;
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (pMVar15 != pMVar19);
            goto LAB_00137f0c;
          }
          iVar9 = 0;
          in_R9D = 0;
          auVar60 = extraout_XMM0_02;
        }
        else if (((bVar8 | (byte)iVar10) & 1) == 0) {
          pMVar26 = pMVar14;
          Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
          uVar12 = top_blob->c * (int)top_blob->cstep;
          auVar60 = extraout_XMM0_06;
          if (0 < (int)uVar12) {
            pMVar26 = (Mat *)0x0;
            memset(top_blob->data,0,(ulong)uVar12 << 2);
            auVar60 = extraout_XMM0_07;
          }
          if (iVar9 < 1) {
            in_R9D = 0;
            pMVar15 = pMVar26;
            goto LAB_0013b4f4;
          }
          pvVar34 = bottom_blob->data;
          iVar9 = bottom_blob->w;
          pvVar31 = top_blob->data;
          sVar3 = bottom_blob->elemsize;
          pMVar15 = (Mat *)0x0;
          do {
            if (0 < (int)uVar13) {
              pMVar27 = (Mat *)0x0;
              do {
                fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar27 * 4));
                auVar60._0_4_ = fVar35 + *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                auVar60._4_12_ = extraout_var_00;
                *(float *)((long)pvVar31 + (long)pMVar27 * 4) = auVar60._0_4_;
                pMVar27 = (Mat *)((long)&pMVar27->data + 1);
              } while (pMVar14 != pMVar27);
            }
            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
            pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
          } while (pMVar15 != pMVar19);
LAB_00137f0c:
          iVar9 = 0;
          in_R9D = 0;
        }
        else {
          iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar10 >> 8),1);
        }
LAB_0013b4f9:
        in_XMM0_Da = auVar60._0_4_;
        if ((char)iVar9 == '\0') goto joined_r0x0013d2c9;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) goto LAB_001363ed;
        pvVar34 = bottom_blob->data;
        in_XMM0_Da = 0.0;
        lVar33 = 0;
        do {
          fVar35 = expf(*(float *)((long)pvVar34 + lVar33 * 4));
          in_XMM0_Da = in_XMM0_Da + fVar35;
          lVar33 = lVar33 + 1;
        } while (iVar11 != lVar33);
        goto LAB_001363f1;
      }
      if (iVar11 != 3) goto LAB_0013d2be;
      uVar13 = bottom_blob->w;
      pMVar19 = (Mat *)(long)(int)uVar13;
      uVar12 = bottom_blob->h;
      uVar23 = (ulong)uVar12;
      uVar25 = bottom_blob->c;
      pMVar14 = (Mat *)(long)(int)uVar25;
      uVar21 = uVar12 * uVar13;
      auVar220._8_4_ = 0xffffffff;
      auVar220._0_8_ = 0xffffffffffffffff;
      auVar220._12_4_ = 0xffffffff;
      auVar225._0_8_ = SUB168(auVar220 ^ auVar134,0) << 0x3f;
      auVar225._8_8_ = SUB168(auVar220 ^ auVar134,8) << 0x3f;
      iVar11 = movmskpd(iVar9,auVar225);
      bVar16 = reduce_c ^ 1;
      if (iVar11 != 0 || bVar16 != 0) {
        if (iVar11 != 0 || reduce_c != false) {
          pMVar15 = (Mat *)(ulong)uVar13;
          bVar24 = (byte)iVar11 >> 1 | bVar20;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) != 0 || bVar16 != 0) {
              pMVar26 = (Mat *)(ulong)uVar7;
              bVar24 = (byte)iVar11 | bVar8;
              if ((bVar24 & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,sVar2,opt->blob_allocator);
                uStack_88 = 0;
                uStack_84 = 0;
                iStack_80 = 0;
                ptr = (void *)0x0;
                uStack_90 = 0;
                uStack_8c = 0;
                local_78 = ZEXT816(0);
                local_68._0_16_ = ZEXT816(0);
                pMVar26 = pMVar19;
                Mat::create((Mat *)&ptr,uVar13,1,uVar25,sVar2,opt->workspace_allocator);
                pvVar34 = ptr;
                in_R9D = 0xffffff9c;
                if (ptr != (void *)0x0) {
                  pMVar26 = (Mat *)local_68._8_8_;
                  if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                    local_50 = (Mat *)local_68._8_8_;
                    uVar21 = local_68._8_4_ * local_68._4_4_;
                    if (0 < (int)uVar21) {
                      pMVar26 = (Mat *)0x0;
                      memset(ptr,0,(ulong)uVar21 << 2);
                    }
                    if (0 < (int)uVar25) {
                      local_e0 = (Mat *)bottom_blob->data;
                      sVar2 = bottom_blob->elemsize;
                      sVar3 = bottom_blob->cstep;
                      lVar33 = CONCAT44(uStack_84,uStack_88) * (long)local_50;
                      local_c0 = (Mat *)0x0;
                      pvVar31 = pvVar34;
                      do {
                        if (0 < (int)uVar12) {
                          uVar21 = 0;
                          pMVar27 = local_e0;
                          do {
                            if (0 < (int)uVar13) {
                              pMVar28 = (Mat *)0x0;
                              do {
                                fVar35 = expf(*(float *)((long)pMVar27 + (long)pMVar28 * 4));
                                *(float *)((long)pvVar31 + (long)pMVar28 * 4) =
                                     fVar35 + *(float *)((long)pvVar31 + (long)pMVar28 * 4);
                                pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                              } while (pMVar15 != pMVar28);
                            }
                            uVar21 = uVar21 + 1;
                            pMVar27 = (Mat *)((long)pMVar27 + (long)pMVar19 * 4);
                          } while (uVar21 != uVar12);
                        }
                        local_c0 = (Mat *)((long)&local_c0->data + 1);
                        local_e0 = (Mat *)((long)local_e0 + sVar2 * sVar3);
                        pvVar31 = (void *)((long)pvVar31 + lVar33);
                      } while (local_c0 != pMVar14);
                    }
                    uVar12 = top_blob->c * (int)top_blob->cstep;
                    if (0 < (int)uVar12) {
                      pMVar26 = (Mat *)0x0;
                      memset(top_blob->data,0,(ulong)uVar12 << 2);
                    }
                    if (0 < (int)uVar25) {
                      pvVar31 = top_blob->data;
                      pMVar19 = (Mat *)0x0;
                      pMVar26 = (Mat *)pvVar34;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar27 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar31 + (long)pMVar27 * 4) =
                                 *(float *)((long)&pMVar26->data + (long)pMVar27 * 4) +
                                 *(float *)((long)pvVar31 + (long)pMVar27 * 4);
                            pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                          } while (pMVar15 != pMVar27);
                        }
                        pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                        pMVar26 = (Mat *)((long)&pMVar26->data +
                                         (long)local_50 * CONCAT44(uStack_84,uStack_88));
                      } while (pMVar19 != pMVar14);
                    }
                    in_R9D = 0;
                  }
                }
                Mat::~Mat((Mat *)&ptr);
                auVar225 = extraout_XMM0_25;
                goto LAB_0013df2a;
              }
              if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
                Mat::create(top_blob,uVar13,uVar12,sVar2,opt->blob_allocator);
                uVar13 = top_blob->c * (int)top_blob->cstep;
                pMVar26 = pMVar15;
                auVar225 = extraout_XMM0_28;
                if (0 < (int)uVar13) {
                  pMVar26 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar13 << 2);
                  auVar225 = extraout_XMM0_29;
                }
                if ((int)uVar25 < 1) goto LAB_0013b8a0;
                sVar2 = bottom_blob->elemsize;
                sVar3 = bottom_blob->cstep;
                pvVar34 = bottom_blob->data;
                pvVar31 = top_blob->data;
                pMVar19 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar21) {
                    uVar23 = 0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                      auVar225._0_4_ = fVar35 + *(float *)((long)pvVar31 + uVar23 * 4);
                      auVar225._4_12_ = extraout_var_04;
                      *(float *)((long)pvVar31 + uVar23 * 4) = auVar225._0_4_;
                      uVar23 = uVar23 + 1;
                    } while (uVar21 != uVar23);
                  }
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                  pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                  bVar29 = false;
                  in_R9D = 0;
                } while (pMVar19 != pMVar14);
              }
              else {
                bVar29 = true;
                if (reduce_c == false && (bVar24 & 1) == 0) {
                  pMVar26 = (Mat *)(ulong)uVar13;
                  Mat::create(top_blob,uVar13,uVar25,sVar2,opt->blob_allocator);
                  uVar21 = top_blob->c * (int)top_blob->cstep;
                  auVar225 = extraout_XMM0_17;
                  if (0 < (int)uVar21) {
                    pMVar26 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar21 << 2);
                    auVar225 = extraout_XMM0_18;
                  }
                  if ((int)uVar25 < 1) goto LAB_0013b8a0;
                  local_b8 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  pvVar34 = top_blob->data;
                  iVar11 = top_blob->w;
                  sVar3 = top_blob->elemsize;
                  sVar4 = bottom_blob->cstep;
                  local_c0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar25 = 0;
                      pvVar31 = local_b8;
                      do {
                        if (0 < (int)uVar13) {
                          pMVar26 = (Mat *)0x0;
                          do {
                            fVar35 = expf(*(float *)((long)pvVar31 + (long)pMVar26 * 4));
                            auVar225._0_4_ = fVar35 + *(float *)((long)pvVar34 + (long)pMVar26 * 4);
                            auVar225._4_12_ = extraout_var_02;
                            *(float *)((long)pvVar34 + (long)pMVar26 * 4) = auVar225._0_4_;
                            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                          } while (pMVar15 != pMVar26);
                        }
                        uVar25 = uVar25 + 1;
                        pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar13 * 4);
                      } while (uVar25 != uVar12);
                    }
                    pMVar26 = (Mat *)((long)&local_c0->data + 1);
                    local_b8 = (void *)((long)local_b8 + sVar2 * sVar4);
                    pvVar34 = (void *)((long)pvVar34 + (long)iVar11 * sVar3);
                    bVar29 = false;
                    in_R9D = 0;
                    local_c0 = pMVar26;
                  } while (pMVar26 != pMVar14);
                }
              }
              goto LAB_0013d2b5;
            }
            Mat::create(top_blob,uVar12,sVar2,opt->blob_allocator);
            uStack_88 = 0;
            uStack_84 = 0;
            iStack_80 = 0;
            ptr = (void *)0x0;
            uStack_90 = 0;
            uStack_8c = 0;
            local_78 = ZEXT816(0);
            local_68._0_16_ = ZEXT816(0);
            pMVar27 = (Mat *)0x1;
            Mat::create((Mat *)&ptr,1,uVar12,uVar25,sVar2,opt->workspace_allocator);
            pvVar34 = ptr;
            in_R9D = 0xffffff9c;
            if (ptr != (void *)0x0) {
              pMVar27 = (Mat *)local_68._8_8_;
              if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                local_48 = (Mat *)local_68._8_8_;
                uVar21 = local_68._8_4_ * local_68._4_4_;
                if (0 < (int)uVar21) {
                  memset(ptr,0,(ulong)uVar21 << 2);
                }
                if (0 < (int)uVar25) {
                  local_a8 = bottom_blob->data;
                  sVar2 = bottom_blob->elemsize;
                  sVar3 = bottom_blob->cstep;
                  local_50 = (Mat *)(CONCAT44(uStack_84,uStack_88) * (long)local_48);
                  local_e0 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar12) {
                      lVar33 = (long)local_50 * (long)local_e0;
                      uVar32 = 0;
                      pvVar31 = local_a8;
                      do {
                        if ((int)uVar13 < 1) {
                          fVar35 = 0.0;
                        }
                        else {
                          fVar35 = 0.0;
                          pMVar26 = (Mat *)0x0;
                          do {
                            fVar36 = expf(*(float *)((long)pvVar31 + (long)pMVar26 * 4));
                            fVar35 = fVar35 + fVar36;
                            pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                          } while (pMVar15 != pMVar26);
                        }
                        *(float *)((long)pvVar34 + uVar32 * 4 + lVar33) = fVar35;
                        uVar32 = uVar32 + 1;
                        pvVar31 = (void *)((long)pvVar31 + (long)pMVar19 * 4);
                      } while (uVar32 != uVar23);
                    }
                    local_e0 = (Mat *)((long)&local_e0->data + 1);
                    local_a8 = (void *)((long)local_a8 + sVar2 * sVar3);
                  } while (local_e0 != pMVar14);
                }
                uVar13 = top_blob->c * (int)top_blob->cstep;
                if (0 < (int)uVar13) {
                  memset(top_blob->data,0,(ulong)uVar13 << 2);
                }
                if (0 < (int)uVar25) {
                  pvVar31 = top_blob->data;
                  pMVar26 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar12) {
                      uVar32 = 0;
                      do {
                        *(float *)((long)pvVar31 + uVar32 * 4) =
                             *(float *)((long)pvVar34 + uVar32 * 4) +
                             *(float *)((long)pvVar31 + uVar32 * 4);
                        uVar32 = uVar32 + 1;
                      } while (uVar23 != uVar32);
                    }
                    pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                    pvVar34 = (void *)((long)pvVar34 +
                                      (long)local_48 * CONCAT44(uStack_84,uStack_88));
                  } while (pMVar26 != pMVar14);
                }
                in_R9D = 0;
                pMVar27 = pMVar14;
              }
            }
            goto LAB_0013d2a4;
          }
          pMVar26 = (Mat *)(ulong)uVar12;
          Mat::create(top_blob,uVar12,uVar25,sVar2,opt->blob_allocator);
          auVar225 = extraout_XMM0_21;
          if (0 < (int)uVar25) {
            local_a8 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            iVar11 = top_blob->w;
            sVar3 = top_blob->elemsize;
            sVar4 = bottom_blob->cstep;
            local_50 = (Mat *)top_blob->data;
            local_e0 = (Mat *)0x0;
            do {
              pMVar27 = local_50;
              if (0 < (int)uVar12) {
                uVar32 = 0;
                pvVar34 = local_a8;
                do {
                  if ((int)uVar13 < 1) {
                    auVar225 = ZEXT816(0);
                  }
                  else {
                    auVar225 = ZEXT816(0);
                    pMVar28 = (Mat *)0x0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar28 * 4));
                      auVar225 = ZEXT416((uint)(auVar225._0_4_ + fVar35));
                      pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                    } while (pMVar15 != pMVar28);
                  }
                  *(int *)((long)&pMVar27->data + uVar32 * 4 + (long)iVar11 * sVar3 * (long)local_e0
                          ) = auVar225._0_4_;
                  uVar32 = uVar32 + 1;
                  pvVar34 = (void *)((long)pvVar34 + (long)pMVar19 * 4);
                } while (uVar32 != uVar23);
              }
              local_e0 = (Mat *)((long)&local_e0->data + 1);
              local_a8 = (void *)((long)local_a8 + sVar2 * sVar4);
            } while (local_e0 != pMVar14);
          }
        }
        else {
          pMVar26 = (Mat *)(ulong)uVar25;
          Mat::create(top_blob,uVar25,sVar2,opt->blob_allocator);
          auVar225 = extraout_XMM0_20;
          if (0 < (int)uVar25) {
            sVar2 = bottom_blob->elemsize;
            sVar3 = bottom_blob->cstep;
            pvVar34 = bottom_blob->data;
            pvVar31 = top_blob->data;
            pMVar19 = (Mat *)0x0;
            do {
              if ((int)uVar21 < 1) {
                auVar225 = ZEXT816(0);
              }
              else {
                auVar225 = ZEXT816(0);
                uVar23 = 0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                  auVar225 = ZEXT416((uint)(auVar225._0_4_ + fVar35));
                  uVar23 = uVar23 + 1;
                } while (uVar21 != uVar23);
              }
              *(int *)((long)pvVar31 + (long)pMVar19 * 4) = auVar225._0_4_;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
            } while (pMVar19 != pMVar14);
          }
        }
        goto LAB_0013b8a0;
      }
      pMVar27 = (Mat *)0x1;
      Mat::create(top_blob,1,sVar2,opt->blob_allocator);
      pAVar6 = opt->workspace_allocator;
      if (uVar25 == 0) {
        pMVar26 = (Mat *)0x0;
        pbVar18 = (bool *)0x0;
        auVar225 = extraout_XMM0_19;
      }
      else {
        uVar23 = sVar2 * (long)pMVar14 + 3 & 0xfffffffffffffffc;
        pMVar19 = (Mat *)(uVar23 + 4);
        if (pAVar6 == (Allocator *)0x0) {
          ptr = (void *)0x0;
          pMVar27 = (Mat *)0x10;
          iVar11 = posix_memalign(&ptr,0x10,(size_t)pMVar19);
          pMVar26 = (Mat *)ptr;
          auVar225 = extraout_XMM0_22;
          if (iVar11 != 0) {
            ptr = (void *)0x0;
            pMVar26 = (Mat *)ptr;
          }
        }
        else {
          pMVar26 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
          auVar225._8_8_ = extraout_XMM0_Qb_05;
          auVar225._0_8_ = extraout_XMM0_Qa_02;
          pMVar27 = pMVar19;
        }
        pbVar18 = (bool *)((long)&pMVar26->data + uVar23);
        *(undefined4 *)((long)&pMVar26->data + uVar23) = 1;
      }
      in_R9D = 0xffffff9c;
      if ((uVar25 != 0) && (pMVar26 != (Mat *)0x0)) {
        if ((int)uVar25 < 1) {
          auVar225 = ZEXT816(0);
        }
        else {
          pvVar34 = bottom_blob->data;
          sVar2 = bottom_blob->elemsize;
          sVar3 = bottom_blob->cstep;
          pMVar19 = (Mat *)0x0;
          do {
            if ((int)uVar21 < 1) {
              fVar35 = 0.0;
            }
            else {
              fVar35 = 0.0;
              uVar23 = 0;
              do {
                fVar36 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                fVar35 = fVar35 + fVar36;
                uVar23 = uVar23 + 1;
              } while (uVar21 != uVar23);
            }
            *(float *)((long)&pMVar26->data + (long)pMVar19 * 4) = fVar35;
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
          } while (pMVar19 != pMVar14);
          auVar225 = ZEXT816(0);
          pMVar19 = (Mat *)0x0;
          do {
            auVar225._0_4_ = auVar225._0_4_ + *(float *)((long)&pMVar26->data + (long)pMVar19 * 4);
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
          } while (pMVar14 != pMVar19);
        }
        *(int *)top_blob->data = auVar225._0_4_;
        in_R9D = 0;
      }
      if (pbVar18 != (bool *)0x0) {
        LOCK();
        *(int *)pbVar18 = *(int *)pbVar18 + -1;
        UNLOCK();
        if (*(int *)pbVar18 == 0) {
          if (pAVar6 != (Allocator *)0x0) {
            auVar225._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
            auVar225._8_8_ = extraout_XMM0_Qb_06;
            goto LAB_0013df2a;
          }
          if (pMVar26 == (Mat *)0x0) goto LAB_0013d2b3;
LAB_0013c69b:
          free(pMVar26);
          auVar225 = extraout_XMM0_23;
        }
      }
LAB_0013d2b3:
      pMVar26 = pMVar27;
      bVar29 = false;
LAB_0013d2b5:
      in_XMM0_Da = auVar225._0_4_;
      if (!bVar29) goto joined_r0x0013d2c9;
    }
    else {
      if (iVar11 == 2) {
        uVar13 = bottom_blob->w;
        pMVar19 = (Mat *)(ulong)uVar13;
        iVar10 = bottom_blob->h;
        lVar33 = (long)iVar10;
        auVar45._8_4_ = 0xffffffff;
        auVar45._0_8_ = 0xffffffffffffffff;
        auVar45._12_4_ = 0xffffffff;
        auVar56._0_8_ = SUB168(auVar45 ^ auVar134,0) << 0x3f;
        auVar56._8_8_ = SUB168(auVar45 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar56);
        if (iVar9 == 0) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,sVar2,opt->blob_allocator);
          local_50 = (Mat *)opt->workspace_allocator;
          if (iVar10 == 0) {
            pMVar14 = (Mat *)0x0;
            pMVar15 = (Mat *)0x0;
            auVar56 = extraout_XMM0;
          }
          else {
            uVar23 = sVar2 * lVar33 + 3 & 0xfffffffffffffffc;
            pMVar14 = (Mat *)(uVar23 + 4);
            if (local_50 == (Mat *)0x0) {
              ptr = (void *)0x0;
              pMVar26 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar14);
              pMVar15 = (Mat *)ptr;
              auVar56 = extraout_XMM0_05;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar15 = (Mat *)ptr;
              }
            }
            else {
              pMVar15 = (Mat *)(**(code **)((long)local_50->data + 0x10))();
              auVar56._8_8_ = extraout_XMM0_Qb;
              auVar56._0_8_ = extraout_XMM0_Qa;
              pMVar26 = pMVar14;
            }
            pMVar14 = (Mat *)((long)&pMVar15->data + uVar23);
            *(undefined4 *)((long)&pMVar15->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar10 != 0) && (pMVar15 != (Mat *)0x0)) {
            if (iVar10 < 1) {
              auVar56 = ZEXT816(0);
            }
            else {
              pvVar34 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              sVar3 = bottom_blob->elemsize;
              lVar22 = 0;
              local_48 = pMVar14;
              do {
                fVar35 = 0.0;
                if (0 < (int)uVar13) {
                  pMVar14 = (Mat *)0x0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar34 + (long)pMVar14 * 4));
                    fVar35 = fVar35 + fVar36;
                    pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  } while (pMVar19 != pMVar14);
                }
                *(float *)((long)&pMVar15->data + lVar22 * 4) = fVar35;
                lVar22 = lVar22 + 1;
                pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
              } while (lVar22 != lVar33);
              auVar56 = ZEXT816(0);
              lVar22 = 0;
              do {
                auVar56._0_4_ = auVar56._0_4_ + *(float *)((long)&pMVar15->data + lVar22 * 4);
                lVar22 = lVar22 + 1;
                pMVar14 = local_48;
              } while (lVar33 != lVar22);
            }
            *(int *)top_blob->data = auVar56._0_4_;
            in_R9D = 0;
          }
          if (pMVar14 != (Mat *)0x0) {
            LOCK();
            *(int *)&pMVar14->data = *(int *)&pMVar14->data + -1;
            UNLOCK();
            if (*(int *)&pMVar14->data == 0) {
              if (local_50 != (Mat *)0x0) {
                auVar56._0_8_ = (**(code **)((long)local_50->data + 0x18))();
                auVar56._8_8_ = extraout_XMM0_Qb_01;
                iVar9 = 0;
                pMVar26 = pMVar15;
                goto LAB_00139256;
              }
              if (pMVar15 != (Mat *)0x0) {
                free(pMVar15);
                auVar56 = extraout_XMM0_09;
              }
            }
          }
          iVar9 = 0;
        }
        else {
          bVar16 = bVar20 | (byte)iVar9 >> 1;
          if ((bVar16 & 1) == 0) {
            pMVar26 = (Mat *)0x1;
            Mat::create(top_blob,1,iVar10,sVar2,opt->blob_allocator);
            auVar56 = extraout_XMM0_01;
            if (0 < iVar10) {
              pvVar34 = bottom_blob->data;
              iVar9 = bottom_blob->w;
              pvVar31 = top_blob->data;
              sVar3 = bottom_blob->elemsize;
              lVar22 = 0;
              do {
                auVar56 = ZEXT816(0);
                if (0 < (int)uVar13) {
                  pMVar14 = (Mat *)0x0;
                  do {
                    fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar14 * 4));
                    auVar56 = ZEXT416((uint)(auVar56._0_4_ + fVar35));
                    pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  } while (pMVar19 != pMVar14);
                }
                *(int *)((long)pvVar31 + lVar22 * 4) = auVar56._0_4_;
                lVar22 = lVar22 + 1;
                pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
              } while (lVar22 != lVar33);
              goto LAB_001373b3;
            }
LAB_001373e1:
            iVar9 = 0;
            in_R9D = 0;
          }
          else if (((bVar8 | (byte)iVar9) & 1) == 0) {
            pMVar26 = pMVar19;
            Mat::create(top_blob,uVar13,1,sVar2,opt->blob_allocator);
            uVar12 = top_blob->c * (int)top_blob->cstep;
            auVar56 = extraout_XMM0_03;
            if (0 < (int)uVar12) {
              pMVar26 = (Mat *)0x0;
              memset(top_blob->data,0,(ulong)uVar12 << 2);
              auVar56 = extraout_XMM0_04;
            }
            if (iVar10 < 1) goto LAB_001373e1;
            pvVar34 = bottom_blob->data;
            iVar9 = bottom_blob->w;
            pvVar31 = top_blob->data;
            sVar3 = bottom_blob->elemsize;
            lVar22 = 0;
            do {
              if (0 < (int)uVar13) {
                pMVar14 = (Mat *)0x0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar14 * 4));
                  auVar56._0_4_ = fVar35 + *(float *)((long)pvVar31 + (long)pMVar14 * 4);
                  auVar56._4_12_ = extraout_var;
                  *(float *)((long)pvVar31 + (long)pMVar14 * 4) = auVar56._0_4_;
                  pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                } while (pMVar19 != pMVar14);
              }
              lVar22 = lVar22 + 1;
              pvVar34 = (void *)((long)pvVar34 + (long)iVar9 * sVar3);
            } while (lVar22 != lVar33);
LAB_001373b3:
            iVar9 = 0;
            in_R9D = 0;
          }
          else {
            iVar9 = (int)CONCAT71((uint7)(uint3)((uint)iVar9 >> 8),1);
            pMVar26 = (Mat *)(ulong)CONCAT31(auVar134._1_3_,bVar16);
          }
        }
LAB_00139256:
        in_XMM0_Da = auVar56._0_4_;
        if ((char)iVar9 == '\0') goto joined_r0x0013d2c9;
      }
      else if (iVar11 == 1) {
        iVar11 = bottom_blob->w;
        pMVar26 = (Mat *)0x1;
        Mat::create(top_blob,1,sVar2,opt->blob_allocator);
        if ((long)iVar11 < 1) {
LAB_001363ed:
          in_XMM0_Da = 0.0;
        }
        else {
          pvVar34 = bottom_blob->data;
          in_XMM0_Da = 0.0;
          lVar33 = 0;
          do {
            fVar35 = expf(*(float *)((long)pvVar34 + lVar33 * 4));
            in_XMM0_Da = in_XMM0_Da + fVar35;
            lVar33 = lVar33 + 1;
          } while (iVar11 != lVar33);
        }
LAB_001363f1:
        *(float *)top_blob->data = in_XMM0_Da;
        goto LAB_0013d2be;
      }
      if (iVar11 == 3) {
        uVar13 = bottom_blob->w;
        pMVar19 = (Mat *)(long)(int)uVar13;
        uVar12 = bottom_blob->h;
        uVar23 = (ulong)uVar12;
        iVar11 = bottom_blob->c;
        pMVar14 = (Mat *)(long)iVar11;
        uVar25 = uVar12 * uVar13;
        auVar70._8_4_ = 0xffffffff;
        auVar70._0_8_ = 0xffffffffffffffff;
        auVar70._12_4_ = 0xffffffff;
        auVar225._0_8_ = SUB168(auVar70 ^ auVar134,0) << 0x3f;
        auVar225._8_8_ = SUB168(auVar70 ^ auVar134,8) << 0x3f;
        iVar9 = movmskpd(iVar9,auVar225);
        bVar16 = reduce_c ^ 1;
        if (iVar9 == 0 && bVar16 == 0) {
          pMVar27 = (Mat *)0x1;
          Mat::create(top_blob,1,1,1,sVar2,opt->blob_allocator);
          pAVar6 = opt->workspace_allocator;
          if (iVar11 == 0) {
            pMVar26 = (Mat *)0x0;
            pbVar18 = (bool *)0x0;
            auVar225 = extraout_XMM0_12;
          }
          else {
            uVar23 = sVar2 * (long)pMVar14 + 3 & 0xfffffffffffffffc;
            pMVar19 = (Mat *)(uVar23 + 4);
            if (pAVar6 == (Allocator *)0x0) {
              ptr = (void *)0x0;
              pMVar27 = (Mat *)0x10;
              iVar9 = posix_memalign(&ptr,0x10,(size_t)pMVar19);
              pMVar26 = (Mat *)ptr;
              auVar225 = extraout_XMM0_15;
              if (iVar9 != 0) {
                ptr = (void *)0x0;
                pMVar26 = (Mat *)ptr;
              }
            }
            else {
              pMVar26 = (Mat *)(**(code **)(*(long *)pAVar6 + 0x10))(pAVar6);
              auVar225._8_8_ = extraout_XMM0_Qb_02;
              auVar225._0_8_ = extraout_XMM0_Qa_01;
              pMVar27 = pMVar19;
            }
            pbVar18 = (bool *)((long)&pMVar26->data + uVar23);
            *(undefined4 *)((long)&pMVar26->data + uVar23) = 1;
          }
          in_R9D = 0xffffff9c;
          if ((iVar11 != 0) && (pMVar26 != (Mat *)0x0)) {
            if (iVar11 < 1) {
              auVar225 = ZEXT816(0);
            }
            else {
              pvVar34 = bottom_blob->data;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pMVar19 = (Mat *)0x0;
              do {
                if ((int)uVar25 < 1) {
                  fVar35 = 0.0;
                }
                else {
                  fVar35 = 0.0;
                  uVar23 = 0;
                  do {
                    fVar36 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                    fVar35 = fVar35 + fVar36;
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                *(float *)((long)&pMVar26->data + (long)pMVar19 * 4) = fVar35;
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
              } while (pMVar19 != pMVar14);
              auVar225 = ZEXT816(0);
              pMVar19 = (Mat *)0x0;
              do {
                auVar225._0_4_ =
                     auVar225._0_4_ + *(float *)((long)&pMVar26->data + (long)pMVar19 * 4);
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar14 != pMVar19);
            }
            *(int *)top_blob->data = auVar225._0_4_;
            in_R9D = 0;
          }
          if (pbVar18 != (bool *)0x0) {
            LOCK();
            *(int *)pbVar18 = *(int *)pbVar18 + -1;
            UNLOCK();
            if (*(int *)pbVar18 == 0) {
              if (pAVar6 != (Allocator *)0x0) {
                auVar225._0_8_ = (**(code **)(*(long *)pAVar6 + 0x18))(pAVar6);
                auVar225._8_8_ = extraout_XMM0_Qb_03;
LAB_0013df2a:
                bVar29 = false;
                goto LAB_0013d2b5;
              }
              if (pMVar26 != (Mat *)0x0) goto LAB_0013c69b;
            }
          }
          goto LAB_0013d2b3;
        }
        if (iVar9 == 0 && reduce_c == false) {
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,1,iVar11,sVar2,opt->blob_allocator);
          auVar225 = extraout_XMM0_13;
          if (0 < iVar11) {
            pvVar34 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            pvVar31 = top_blob->data;
            sVar3 = top_blob->elemsize;
            sVar4 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            pMVar19 = (Mat *)0x0;
            do {
              if ((int)uVar25 < 1) {
                auVar225 = ZEXT816(0);
              }
              else {
                auVar225 = ZEXT816(0);
                uVar23 = 0;
                do {
                  fVar35 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                  auVar225 = ZEXT416((uint)(auVar225._0_4_ + fVar35));
                  uVar23 = uVar23 + 1;
                } while (uVar25 != uVar23);
              }
              *(int *)((long)pvVar31 + sVar3 * sVar4 * (long)pMVar19) = auVar225._0_4_;
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar5);
            } while (pMVar19 != pMVar14);
          }
        }
        else {
          pMVar15 = (Mat *)(ulong)uVar13;
          bVar24 = (byte)iVar9 >> 1 | bVar20;
          if (reduce_c != false || (bVar24 & 1) != 0) {
            if ((bVar24 & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,1,uVar12,1,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = ZEXT816(0);
              local_68._0_16_ = ZEXT816(0);
              pMVar27 = (Mat *)0x1;
              Mat::create((Mat *)&ptr,1,uVar12,iVar11,sVar2,opt->workspace_allocator);
              pvVar34 = ptr;
              in_R9D = 0xffffff9c;
              if (ptr != (void *)0x0) {
                pMVar27 = (Mat *)local_68._8_8_;
                if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                  local_48 = (Mat *)local_68._8_8_;
                  uVar25 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar25) {
                    memset(ptr,0,(ulong)uVar25 << 2);
                  }
                  if (0 < iVar11) {
                    local_a8 = bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    local_50 = (Mat *)(CONCAT44(uStack_84,uStack_88) * (long)local_48);
                    local_e0 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar12) {
                        lVar33 = (long)local_50 * (long)local_e0;
                        uVar32 = 0;
                        pvVar31 = local_a8;
                        do {
                          if ((int)uVar13 < 1) {
                            fVar35 = 0.0;
                          }
                          else {
                            fVar35 = 0.0;
                            pMVar26 = (Mat *)0x0;
                            do {
                              fVar36 = expf(*(float *)((long)pvVar31 + (long)pMVar26 * 4));
                              fVar35 = fVar35 + fVar36;
                              pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                            } while (pMVar15 != pMVar26);
                          }
                          *(float *)((long)pvVar34 + uVar32 * 4 + lVar33) = fVar35;
                          uVar32 = uVar32 + 1;
                          pvVar31 = (void *)((long)pvVar31 + (long)pMVar19 * 4);
                        } while (uVar32 != uVar23);
                      }
                      local_e0 = (Mat *)((long)&local_e0->data + 1);
                      local_a8 = (void *)((long)local_a8 + sVar2 * sVar3);
                    } while (local_e0 != pMVar14);
                  }
                  uVar13 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar13) {
                    memset(top_blob->data,0,(ulong)uVar13 << 2);
                  }
                  if (0 < iVar11) {
                    pvVar31 = top_blob->data;
                    pMVar26 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar12) {
                        uVar32 = 0;
                        do {
                          *(float *)((long)pvVar31 + uVar32 * 4) =
                               *(float *)((long)pvVar34 + uVar32 * 4) +
                               *(float *)((long)pvVar31 + uVar32 * 4);
                          uVar32 = uVar32 + 1;
                        } while (uVar23 != uVar32);
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                      pvVar34 = (void *)((long)pvVar34 +
                                        (long)local_48 * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar26 != pMVar14);
                  }
                  in_R9D = 0;
                  pMVar27 = pMVar14;
                }
              }
LAB_0013d2a4:
              Mat::~Mat((Mat *)&ptr);
              auVar225 = extraout_XMM0_24;
              goto LAB_0013d2b3;
            }
            pMVar26 = (Mat *)(ulong)uVar7;
            bVar24 = (byte)iVar9 | bVar8;
            if ((bVar24 & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,uVar13,1,1,sVar2,opt->blob_allocator);
              uStack_88 = 0;
              uStack_84 = 0;
              iStack_80 = 0;
              ptr = (void *)0x0;
              uStack_90 = 0;
              uStack_8c = 0;
              local_78 = ZEXT816(0);
              local_68._0_16_ = ZEXT816(0);
              pMVar27 = pMVar19;
              Mat::create((Mat *)&ptr,uVar13,1,iVar11,sVar2,opt->workspace_allocator);
              pvVar34 = ptr;
              in_R9D = 0xffffff9c;
              if (ptr != (void *)0x0) {
                pMVar27 = (Mat *)local_68._8_8_;
                if (local_68._8_8_ * (long)(int)local_68._4_4_ != 0) {
                  local_50 = (Mat *)local_68._8_8_;
                  uVar25 = local_68._8_4_ * local_68._4_4_;
                  if (0 < (int)uVar25) {
                    pMVar27 = (Mat *)0x0;
                    memset(ptr,0,(ulong)uVar25 << 2);
                  }
                  if (0 < iVar11) {
                    local_e0 = (Mat *)bottom_blob->data;
                    sVar2 = bottom_blob->elemsize;
                    sVar3 = bottom_blob->cstep;
                    lVar33 = CONCAT44(uStack_84,uStack_88) * (long)local_50;
                    local_c0 = (Mat *)0x0;
                    pvVar31 = pvVar34;
                    do {
                      if (0 < (int)uVar12) {
                        uVar25 = 0;
                        pMVar26 = local_e0;
                        do {
                          if (0 < (int)uVar13) {
                            pMVar28 = (Mat *)0x0;
                            do {
                              fVar35 = expf(*(float *)((long)pMVar26 + (long)pMVar28 * 4));
                              *(float *)((long)pvVar31 + (long)pMVar28 * 4) =
                                   fVar35 + *(float *)((long)pvVar31 + (long)pMVar28 * 4);
                              pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                            } while (pMVar15 != pMVar28);
                          }
                          uVar25 = uVar25 + 1;
                          pMVar26 = (Mat *)((long)pMVar26 + (long)pMVar19 * 4);
                        } while (uVar25 != uVar12);
                      }
                      local_c0 = (Mat *)((long)&local_c0->data + 1);
                      local_e0 = (Mat *)((long)local_e0 + sVar2 * sVar3);
                      pvVar31 = (void *)((long)pvVar31 + lVar33);
                    } while (local_c0 != pMVar14);
                  }
                  uVar12 = top_blob->c * (int)top_blob->cstep;
                  if (0 < (int)uVar12) {
                    pMVar27 = (Mat *)0x0;
                    memset(top_blob->data,0,(ulong)uVar12 << 2);
                  }
                  if (0 < iVar11) {
                    pvVar31 = top_blob->data;
                    pMVar26 = (Mat *)0x0;
                    pMVar27 = (Mat *)pvVar34;
                    do {
                      if (0 < (int)uVar13) {
                        pMVar19 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar31 + (long)pMVar19 * 4) =
                               *(float *)((long)&pMVar27->data + (long)pMVar19 * 4) +
                               *(float *)((long)pvVar31 + (long)pMVar19 * 4);
                          pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                        } while (pMVar15 != pMVar19);
                      }
                      pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                      pMVar27 = (Mat *)((long)&pMVar27->data +
                                       (long)local_50 * CONCAT44(uStack_84,uStack_88));
                    } while (pMVar26 != pMVar14);
                  }
                  in_R9D = 0;
                }
              }
              goto LAB_0013d2a4;
            }
            if (((bVar20 | bVar8) & 1) == 0 && bVar16 == 0) {
              Mat::create(top_blob,uVar13,uVar12,1,sVar2,opt->blob_allocator);
              uVar13 = top_blob->c * (int)top_blob->cstep;
              pMVar26 = pMVar15;
              auVar225 = extraout_XMM0_26;
              if (0 < (int)uVar13) {
                pMVar26 = (Mat *)0x0;
                memset(top_blob->data,0,(ulong)uVar13 << 2);
                auVar225 = extraout_XMM0_27;
              }
              if (iVar11 < 1) goto LAB_0013b8a0;
              sVar2 = bottom_blob->elemsize;
              sVar3 = bottom_blob->cstep;
              pvVar34 = bottom_blob->data;
              pvVar31 = top_blob->data;
              pMVar19 = (Mat *)0x0;
              do {
                if (0 < (int)uVar25) {
                  uVar23 = 0;
                  do {
                    fVar35 = expf(*(float *)((long)pvVar34 + uVar23 * 4));
                    auVar225._0_4_ = fVar35 + *(float *)((long)pvVar31 + uVar23 * 4);
                    auVar225._4_12_ = extraout_var_03;
                    *(float *)((long)pvVar31 + uVar23 * 4) = auVar225._0_4_;
                    uVar23 = uVar23 + 1;
                  } while (uVar25 != uVar23);
                }
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar3);
                bVar29 = false;
                in_R9D = 0;
              } while (pMVar19 != pMVar14);
            }
            else {
              bVar29 = true;
              if (reduce_c == false && (bVar24 & 1) == 0) {
                pMVar26 = (Mat *)(ulong)uVar13;
                Mat::create(top_blob,uVar13,1,iVar11,sVar2,opt->blob_allocator);
                sVar2 = top_blob->cstep;
                uVar25 = top_blob->c * (int)sVar2;
                auVar225 = extraout_XMM0_10;
                if (0 < (int)uVar25) {
                  pMVar26 = (Mat *)0x0;
                  memset(top_blob->data,0,(ulong)uVar25 << 2);
                  auVar225 = extraout_XMM0_11;
                }
                if (iVar11 < 1) goto LAB_0013b8a0;
                local_b8 = bottom_blob->data;
                sVar3 = bottom_blob->elemsize;
                pvVar34 = top_blob->data;
                sVar4 = bottom_blob->cstep;
                sVar5 = top_blob->elemsize;
                local_c0 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar12) {
                    uVar25 = 0;
                    pvVar31 = local_b8;
                    do {
                      if (0 < (int)uVar13) {
                        pMVar26 = (Mat *)0x0;
                        do {
                          fVar35 = expf(*(float *)((long)pvVar31 + (long)pMVar26 * 4));
                          auVar225._0_4_ = fVar35 + *(float *)((long)pvVar34 + (long)pMVar26 * 4);
                          auVar225._4_12_ = extraout_var_01;
                          *(float *)((long)pvVar34 + (long)pMVar26 * 4) = auVar225._0_4_;
                          pMVar26 = (Mat *)((long)&pMVar26->data + 1);
                        } while (pMVar15 != pMVar26);
                      }
                      uVar25 = uVar25 + 1;
                      pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar13 * 4);
                    } while (uVar25 != uVar12);
                  }
                  pMVar26 = (Mat *)((long)&local_c0->data + 1);
                  local_b8 = (void *)((long)local_b8 + sVar3 * sVar4);
                  pvVar34 = (void *)((long)pvVar34 + sVar2 * sVar5);
                  bVar29 = false;
                  in_R9D = 0;
                  local_c0 = pMVar26;
                } while (pMVar26 != pMVar14);
              }
            }
            goto LAB_0013d2b5;
          }
          pMVar26 = (Mat *)0x1;
          Mat::create(top_blob,1,uVar12,iVar11,sVar2,opt->blob_allocator);
          auVar225 = extraout_XMM0_14;
          if (0 < iVar11) {
            local_a8 = bottom_blob->data;
            sVar2 = bottom_blob->elemsize;
            sVar3 = top_blob->elemsize;
            sVar4 = top_blob->cstep;
            sVar5 = bottom_blob->cstep;
            local_50 = (Mat *)top_blob->data;
            local_e0 = (Mat *)0x0;
            do {
              pMVar27 = local_50;
              if (0 < (int)uVar12) {
                uVar32 = 0;
                pvVar34 = local_a8;
                do {
                  if ((int)uVar13 < 1) {
                    auVar225 = ZEXT816(0);
                  }
                  else {
                    auVar225 = ZEXT816(0);
                    pMVar28 = (Mat *)0x0;
                    do {
                      fVar35 = expf(*(float *)((long)pvVar34 + (long)pMVar28 * 4));
                      auVar225 = ZEXT416((uint)(auVar225._0_4_ + fVar35));
                      pMVar28 = (Mat *)((long)&pMVar28->data + 1);
                    } while (pMVar15 != pMVar28);
                  }
                  *(int *)((long)&pMVar27->data + uVar32 * 4 + sVar3 * sVar4 * (long)local_e0) =
                       auVar225._0_4_;
                  uVar32 = uVar32 + 1;
                  pvVar34 = (void *)((long)pvVar34 + (long)pMVar19 * 4);
                } while (uVar32 != uVar23);
              }
              local_e0 = (Mat *)((long)&local_e0->data + 1);
              local_a8 = (void *)((long)local_a8 + sVar2 * sVar5);
            } while (local_e0 != pMVar14);
          }
        }
LAB_0013b8a0:
        bVar29 = false;
        in_R9D = 0;
        goto LAB_0013d2b5;
      }
    }
LAB_0013d2be:
    in_R9D = 0;
joined_r0x0013d2c9:
    if (in_R9D == 0) {
      reduction_post_process<ncnn::post_process_log<float>>(top_blob,in_XMM0_Da,(Option *)pMVar26);
      return 0;
    }
    return -100;
  }
  if (in_R9D != 0) {
    return -100;
  }
joined_r0x0013e525:
  if (1.1920929e-07 < ABS(fVar35 + -1.0)) {
LAB_0013e527:
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar35,(Option *)pMVar26);
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[3] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i=0; i<reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims + 1;
            axes_flag[axis - 1] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction< std::plus<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction< reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction< reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction< std::multiplies<float>, std::multiplies<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_c, false, coeff, keepdims, opt);
    
    if (operation == ReductionOp_L1)
        return reduction< reduction_op_asum<float>, std::plus<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction< reduction_op_sumsq<float>, std::plus<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSum)
        return reduction< std::plus<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);
    
    if (operation == ReductionOp_LogSumExp)
        return reduction< reduction_op_sumsexp<float>, std::plus<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}